

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx::SubGridIntersectorKMoeller<8,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ushort uVar5;
  ushort uVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  RTCRayQueryContext *pRVar10;
  size_t k;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  uint uVar93;
  int iVar94;
  uint uVar95;
  ulong uVar96;
  long lVar97;
  long lVar98;
  float *pfVar99;
  long lVar100;
  ulong uVar101;
  long lVar102;
  long lVar103;
  ulong *puVar104;
  NodeRef root;
  ulong uVar105;
  undefined4 uVar106;
  ulong unaff_R14;
  ulong uVar107;
  undefined1 (*pauVar108) [32];
  bool bVar109;
  undefined1 auVar110 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar118 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar119 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar140 [64];
  undefined1 auVar143 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar141;
  float fVar162;
  float fVar163;
  undefined1 auVar142 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar144 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar164;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar221;
  undefined1 auVar209 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar237;
  uint uVar238;
  float fVar239;
  uint uVar240;
  float fVar241;
  uint uVar242;
  float fVar243;
  uint uVar244;
  float fVar245;
  uint uVar246;
  float fVar247;
  uint uVar248;
  float fVar249;
  uint uVar250;
  float fVar251;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar262;
  float fVar263;
  float fVar266;
  float fVar267;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar268;
  float fVar269;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar270 [32];
  undefined1 auVar279 [12];
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar296;
  float fVar297;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  Precalculations pre;
  vfloat<8> upper_y;
  vfloat<8> lower_y;
  vbool<8> terminated;
  vfloat<8> upper_z;
  vfloat<8> lower_z;
  TravRayK<8,_false> tray;
  vfloat<8> lower_x;
  vfloat<8> upper_x;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_60c9;
  long local_60c8;
  undefined1 local_60c0 [32];
  undefined1 local_60a0 [32];
  undefined1 local_6080 [16];
  long local_6068;
  undefined1 local_6060 [8];
  float fStack_6058;
  float fStack_6054;
  float fStack_6050;
  float fStack_604c;
  float fStack_6048;
  float fStack_6044;
  undefined1 local_6040 [16];
  RayK<8> *local_6028;
  undefined1 local_6020 [32];
  undefined1 local_6000 [8];
  float fStack_5ff8;
  float fStack_5ff4;
  float fStack_5ff0;
  float fStack_5fec;
  float fStack_5fe8;
  undefined1 local_5fe0 [8];
  float fStack_5fd8;
  float fStack_5fd4;
  undefined1 auStack_5fd0 [8];
  float fStack_5fc8;
  float fStack_5fc4;
  undefined1 local_5fc0 [8];
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  RTCHitN *local_5fa0;
  uint local_5f98;
  undefined1 local_5f80 [32];
  undefined1 local_5f60 [32];
  undefined1 local_5f40 [8];
  float fStack_5f38;
  float fStack_5f34;
  float fStack_5f30;
  float fStack_5f2c;
  float fStack_5f28;
  float fStack_5f24;
  undefined1 (*local_5f18) [32];
  BVH *local_5f10;
  ulong local_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  undefined1 local_5ee0 [32];
  undefined1 local_5ec0 [32];
  undefined1 local_5ea0 [32];
  undefined1 local_5e80 [32];
  undefined1 local_5e60 [20];
  uint uStack_5e4c;
  uint uStack_5e48;
  uint uStack_5e44;
  Intersectors *local_5e28;
  long local_5e20;
  long local_5e18;
  long local_5e10;
  ulong local_5e08;
  undefined1 local_5e00 [32];
  undefined8 local_5de0;
  undefined8 uStack_5dd8;
  float fStack_5dd0;
  float fStack_5dcc;
  float fStack_5dc8;
  float fStack_5dc4;
  undefined8 local_5dc0;
  undefined8 uStack_5db8;
  float fStack_5db0;
  float fStack_5dac;
  float fStack_5da8;
  float fStack_5da4;
  undefined1 local_5da0 [8];
  float fStack_5d98;
  float fStack_5d94;
  float fStack_5d90;
  float fStack_5d8c;
  float fStack_5d88;
  float fStack_5d84;
  undefined1 local_5d80 [8];
  float fStack_5d78;
  float fStack_5d74;
  float fStack_5d70;
  float fStack_5d6c;
  float fStack_5d68;
  float fStack_5d64;
  undefined1 local_5d60 [8];
  float fStack_5d58;
  float fStack_5d54;
  float fStack_5d50;
  float fStack_5d4c;
  float fStack_5d48;
  float fStack_5d44;
  undefined1 local_5d40 [16];
  undefined1 local_5d30 [16];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5d20;
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [8];
  float fStack_5c58;
  float fStack_5c54;
  float fStack_5c50;
  float fStack_5c4c;
  float fStack_5c48;
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  undefined1 local_5c20 [8];
  float fStack_5c18;
  float fStack_5c14;
  float fStack_5c10;
  float fStack_5c0c;
  float fStack_5c08;
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [8];
  float fStack_5b58;
  float fStack_5b54;
  float fStack_5b50;
  float fStack_5b4c;
  float fStack_5b48;
  float fStack_5b44;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  float local_5ae0;
  float fStack_5adc;
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  undefined4 uStack_5ac4;
  undefined1 local_5ac0 [16];
  undefined1 local_5ab0 [16];
  undefined1 local_5aa0 [16];
  undefined1 local_5a90 [16];
  uint local_5a80;
  uint uStack_5a7c;
  uint uStack_5a78;
  uint uStack_5a74;
  uint uStack_5a70;
  uint uStack_5a6c;
  uint uStack_5a68;
  uint uStack_5a64;
  undefined1 local_5a60 [32];
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 uStack_5a30;
  undefined8 uStack_5a28;
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 local_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 local_59f0;
  undefined8 uStack_59e8;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 local_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 local_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 local_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 local_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 local_5950;
  undefined8 uStack_5948;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  float fStack_58c4;
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  float fStack_58a4;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  float fStack_5884;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  float fStack_5844;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar185 [36];
  undefined1 auVar210 [64];
  undefined1 auVar229 [32];
  undefined1 auVar298 [36];
  
  local_5f10 = (BVH *)This->ptr;
  if ((local_5f10->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar119 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar111 = vpcmpeqd_avx(auVar119,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar119 = vpcmpeqd_avx(auVar119,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar142 = ZEXT816(0) << 0x40;
      auVar134 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar142),5);
      auVar196._16_16_ = auVar119;
      auVar196._0_16_ = auVar111;
      auVar150 = auVar196 & auVar134;
      if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar150 >> 0x7f,0) != '\0') ||
            (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar150 >> 0xbf,0) != '\0') ||
          (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar150[0x1f] < '\0') {
        local_5940 = vandps_avx(auVar134,auVar196);
        local_5d20._0_8_ = *(undefined8 *)ray;
        local_5d20._8_8_ = *(undefined8 *)(ray + 8);
        local_5d20._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5d20._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5d20._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5d20._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5d20._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5d20._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5d20._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5d20._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5d20._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5d20._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5cc0 = *(undefined1 (*) [32])(ray + 0x80);
        local_5ca0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5c80 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar252._8_4_ = 0x7fffffff;
        auVar252._0_8_ = 0x7fffffff7fffffff;
        auVar252._12_4_ = 0x7fffffff;
        auVar252._16_4_ = 0x7fffffff;
        auVar252._20_4_ = 0x7fffffff;
        auVar252._24_4_ = 0x7fffffff;
        auVar252._28_4_ = 0x7fffffff;
        auVar226._8_4_ = 0x219392ef;
        auVar226._0_8_ = 0x219392ef219392ef;
        auVar226._12_4_ = 0x219392ef;
        auVar226._16_4_ = 0x219392ef;
        auVar226._20_4_ = 0x219392ef;
        auVar226._24_4_ = 0x219392ef;
        auVar226._28_4_ = 0x219392ef;
        auVar134 = vandps_avx(auVar252,local_5cc0);
        auVar134 = vcmpps_avx(auVar134,auVar226,1);
        auVar150 = vblendvps_avx(local_5cc0,auVar226,auVar134);
        auVar134 = vandps_avx(auVar252,local_5ca0);
        auVar134 = vcmpps_avx(auVar134,auVar226,1);
        auVar196 = vblendvps_avx(local_5ca0,auVar226,auVar134);
        auVar134 = vandps_avx(auVar252,local_5c80);
        auVar134 = vcmpps_avx(auVar134,auVar226,1);
        auVar134 = vblendvps_avx(local_5c80,auVar226,auVar134);
        auVar38 = vrcpps_avx(auVar150);
        fVar163 = auVar38._0_4_;
        fVar164 = auVar38._4_4_;
        auVar39._4_4_ = auVar150._4_4_ * fVar164;
        auVar39._0_4_ = auVar150._0_4_ * fVar163;
        fVar165 = auVar38._8_4_;
        auVar39._8_4_ = auVar150._8_4_ * fVar165;
        fVar166 = auVar38._12_4_;
        auVar39._12_4_ = auVar150._12_4_ * fVar166;
        fVar167 = auVar38._16_4_;
        auVar39._16_4_ = auVar150._16_4_ * fVar167;
        fVar262 = auVar38._20_4_;
        auVar39._20_4_ = auVar150._20_4_ * fVar262;
        fVar212 = auVar38._24_4_;
        auVar39._24_4_ = auVar150._24_4_ * fVar212;
        auVar39._28_4_ = auVar150._28_4_;
        auVar230._8_4_ = 0x3f800000;
        auVar230._0_8_ = &DAT_3f8000003f800000;
        auVar230._12_4_ = 0x3f800000;
        auVar230._16_4_ = 0x3f800000;
        auVar230._20_4_ = 0x3f800000;
        auVar230._24_4_ = 0x3f800000;
        auVar230._28_4_ = 0x3f800000;
        auVar150 = vsubps_avx(auVar230,auVar39);
        local_5c60._0_4_ = fVar163 + fVar163 * auVar150._0_4_;
        local_5c60._4_4_ = fVar164 + fVar164 * auVar150._4_4_;
        fStack_5c58 = fVar165 + fVar165 * auVar150._8_4_;
        fStack_5c54 = fVar166 + fVar166 * auVar150._12_4_;
        fStack_5c50 = fVar167 + fVar167 * auVar150._16_4_;
        fStack_5c4c = fVar262 + fVar262 * auVar150._20_4_;
        fStack_5c48 = fVar212 + fVar212 * auVar150._24_4_;
        register0x0000129c = auVar38._28_4_ + auVar150._28_4_;
        auVar150 = vrcpps_avx(auVar196);
        fVar163 = auVar150._0_4_;
        fVar164 = auVar150._4_4_;
        auVar38._4_4_ = auVar196._4_4_ * fVar164;
        auVar38._0_4_ = auVar196._0_4_ * fVar163;
        fVar165 = auVar150._8_4_;
        auVar38._8_4_ = auVar196._8_4_ * fVar165;
        fVar166 = auVar150._12_4_;
        auVar38._12_4_ = auVar196._12_4_ * fVar166;
        fVar167 = auVar150._16_4_;
        auVar38._16_4_ = auVar196._16_4_ * fVar167;
        fVar262 = auVar150._20_4_;
        auVar38._20_4_ = auVar196._20_4_ * fVar262;
        fVar212 = auVar150._24_4_;
        auVar38._24_4_ = auVar196._24_4_ * fVar212;
        auVar38._28_4_ = auVar196._28_4_;
        auVar196 = vsubps_avx(auVar230,auVar38);
        local_5c40._0_4_ = fVar163 + fVar163 * auVar196._0_4_;
        local_5c40._4_4_ = fVar164 + fVar164 * auVar196._4_4_;
        fStack_5c38 = fVar165 + fVar165 * auVar196._8_4_;
        fStack_5c34 = fVar166 + fVar166 * auVar196._12_4_;
        fStack_5c30 = fVar167 + fVar167 * auVar196._16_4_;
        fStack_5c2c = fVar262 + fVar262 * auVar196._20_4_;
        fStack_5c28 = fVar212 + fVar212 * auVar196._24_4_;
        register0x000012dc = auVar150._28_4_ + auVar196._28_4_;
        auVar150 = vrcpps_avx(auVar134);
        fVar163 = auVar150._0_4_;
        fVar164 = auVar150._4_4_;
        auVar40._4_4_ = auVar134._4_4_ * fVar164;
        auVar40._0_4_ = auVar134._0_4_ * fVar163;
        fVar165 = auVar150._8_4_;
        auVar40._8_4_ = auVar134._8_4_ * fVar165;
        fVar166 = auVar150._12_4_;
        auVar40._12_4_ = auVar134._12_4_ * fVar166;
        fVar167 = auVar150._16_4_;
        auVar40._16_4_ = auVar134._16_4_ * fVar167;
        fVar262 = auVar150._20_4_;
        auVar40._20_4_ = auVar134._20_4_ * fVar262;
        fVar212 = auVar150._24_4_;
        auVar40._24_4_ = auVar134._24_4_ * fVar212;
        auVar40._28_4_ = auVar134._28_4_;
        auVar134 = vsubps_avx(auVar230,auVar40);
        local_5c20._0_4_ = fVar163 + fVar163 * auVar134._0_4_;
        local_5c20._4_4_ = fVar164 + fVar164 * auVar134._4_4_;
        fStack_5c18 = fVar165 + fVar165 * auVar134._8_4_;
        fStack_5c14 = fVar166 + fVar166 * auVar134._12_4_;
        fStack_5c10 = fVar167 + fVar167 * auVar134._16_4_;
        fStack_5c0c = fVar262 + fVar262 * auVar134._20_4_;
        fStack_5c08 = fVar212 + fVar212 * auVar134._24_4_;
        register0x0000131c = auVar150._28_4_ + auVar134._28_4_;
        auVar150._8_4_ = 0x20;
        auVar150._0_8_ = 0x2000000020;
        auVar150._12_4_ = 0x20;
        auVar150._16_4_ = 0x20;
        auVar150._20_4_ = 0x20;
        auVar150._24_4_ = 0x20;
        auVar150._28_4_ = 0x20;
        auVar134 = vcmpps_avx(_local_5c60,ZEXT1632(auVar142),1);
        local_5c00 = vandps_avx(auVar134,auVar150);
        auVar150 = ZEXT1632(auVar142);
        auVar134 = vcmpps_avx(_local_5c40,auVar150,5);
        auVar197._8_4_ = 0x40;
        auVar197._0_8_ = 0x4000000040;
        auVar197._12_4_ = 0x40;
        auVar197._16_4_ = 0x40;
        auVar197._20_4_ = 0x40;
        auVar197._24_4_ = 0x40;
        auVar197._28_4_ = 0x40;
        auVar227._8_4_ = 0x60;
        auVar227._0_8_ = 0x6000000060;
        auVar227._12_4_ = 0x60;
        auVar227._16_4_ = 0x60;
        auVar227._20_4_ = 0x60;
        auVar227._24_4_ = 0x60;
        auVar227._28_4_ = 0x60;
        local_5be0 = vblendvps_avx(auVar227,auVar197,auVar134);
        auVar134 = vcmpps_avx(_local_5c20,auVar150,5);
        auVar198._8_4_ = 0x80;
        auVar198._0_8_ = 0x8000000080;
        auVar198._12_4_ = 0x80;
        auVar198._16_4_ = 0x80;
        auVar198._20_4_ = 0x80;
        auVar198._24_4_ = 0x80;
        auVar198._28_4_ = 0x80;
        auVar207._8_4_ = 0xa0;
        auVar207._0_8_ = 0xa0000000a0;
        auVar207._12_4_ = 0xa0;
        auVar207._16_4_ = 0xa0;
        auVar207._20_4_ = 0xa0;
        auVar207._24_4_ = 0xa0;
        auVar207._28_4_ = 0xa0;
        auVar210 = ZEXT3264(auVar207);
        local_5bc0 = vblendvps_avx(auVar207,auVar198,auVar134);
        auVar134 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar150);
        auVar150 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar150);
        auVar120._8_4_ = 0x7f800000;
        auVar120._0_8_ = 0x7f8000007f800000;
        auVar120._12_4_ = 0x7f800000;
        auVar120._16_4_ = 0x7f800000;
        auVar120._20_4_ = 0x7f800000;
        auVar120._24_4_ = 0x7f800000;
        auVar120._28_4_ = 0x7f800000;
        local_5ba0 = vblendvps_avx(auVar120,auVar134,local_5940);
        auVar134._8_4_ = 0xff800000;
        auVar134._0_8_ = 0xff800000ff800000;
        auVar134._12_4_ = 0xff800000;
        auVar134._16_4_ = 0xff800000;
        auVar134._20_4_ = 0xff800000;
        auVar134._24_4_ = 0xff800000;
        auVar134._28_4_ = 0xff800000;
        auVar184 = ZEXT3264(auVar134);
        local_5b80 = vblendvps_avx(auVar134,auVar150,local_5940);
        auVar134 = vcmpps_avx(local_5b80,local_5b80,0xf);
        local_5e60._4_4_ = local_5940._4_4_ ^ auVar134._4_4_;
        local_5e60._0_4_ = local_5940._0_4_ ^ auVar134._0_4_;
        local_5e60._8_4_ = local_5940._8_4_ ^ auVar134._8_4_;
        local_5e60._12_4_ = local_5940._12_4_ ^ auVar134._12_4_;
        local_5e60._16_4_ = local_5940._16_4_ ^ auVar134._16_4_;
        uStack_5e4c = local_5940._20_4_ ^ auVar134._20_4_;
        uStack_5e48 = local_5940._24_4_ ^ auVar134._24_4_;
        uStack_5e44 = local_5940._28_4_ ^ auVar134._28_4_;
        local_5e28 = This;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar101 = 7;
        }
        else {
          uVar101 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_6028 = ray + 0x100;
        puVar104 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar108 = (undefined1 (*) [32])local_4640;
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        local_5808 = (local_5f10->root).ptr;
        local_4660 = local_5ba0;
        local_5f00 = mm_lookupmask_ps._16_8_;
        uStack_5ef8 = mm_lookupmask_ps._24_8_;
        uStack_5ef0 = mm_lookupmask_ps._16_8_;
        uStack_5ee8 = mm_lookupmask_ps._24_8_;
        local_5f18 = (undefined1 (*) [32])&local_5a80;
        local_5f08 = uVar101;
        do {
          auVar119 = auVar184._0_16_;
          pauVar108 = pauVar108 + -1;
          root.ptr = puVar104[-1];
          puVar104 = puVar104 + -1;
          if (root.ptr == 0xfffffffffffffff8) {
LAB_0049a2c0:
            iVar94 = 3;
          }
          else {
            local_60c0 = *pauVar108;
            auVar161 = ZEXT3264(local_60c0);
            auVar134 = vcmpps_avx(local_60c0,local_5b80,1);
            if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar134 >> 0x7f,0) == '\0') &&
                  (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar134 >> 0xbf,0) == '\0') &&
                (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar134[0x1f]) {
LAB_0049a2d1:
              iVar94 = 2;
            }
            else {
              uVar106 = vmovmskps_avx(auVar134);
              unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar106);
              iVar94 = 0;
              if ((uint)POPCOUNT(uVar106) <= uVar101) {
                for (; unaff_R14 != 0; unaff_R14 = unaff_R14 & unaff_R14 - 1) {
                  k = 0;
                  if (unaff_R14 != 0) {
                    for (; (unaff_R14 >> k & 1) == 0; k = k + 1) {
                    }
                  }
                  local_60a0._0_8_ = k;
                  auVar184 = ZEXT1664(auVar184._0_16_);
                  auVar210 = ZEXT1664(auVar210._0_16_);
                  bVar109 = occluded1(local_5e28,local_5f10,root,k,&local_60c9,ray,
                                      (TravRayK<8,_false> *)&local_5d20.field_0,context);
                  auVar119 = auVar184._0_16_;
                  if (bVar109) {
                    *(undefined4 *)(local_5e60 + local_60a0._0_8_ * 4) = 0xffffffff;
                  }
                  uVar101 = local_5f08;
                }
                auVar119 = vpcmpeqd_avx(auVar119,auVar119);
                auVar111 = vpcmpgtd_avx(stack0xffffffffffffa1b0,auVar119);
                auVar119 = vpcmpgtd_avx(local_5e60._0_16_,auVar119);
                auVar184 = ZEXT1664(auVar119);
                auVar119 = vpor_avx(auVar119,auVar111);
                iVar94 = 3;
                auVar161 = ZEXT3264(local_60c0);
                unaff_R14 = 0;
                if ((((auVar119 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar119 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar119 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar119[0xf] < '\0') {
                  auVar183._8_4_ = 0xff800000;
                  auVar183._0_8_ = 0xff800000ff800000;
                  auVar183._12_4_ = 0xff800000;
                  auVar183._16_4_ = 0xff800000;
                  auVar183._20_4_ = 0xff800000;
                  auVar183._24_4_ = 0xff800000;
                  auVar183._28_4_ = 0xff800000;
                  auVar184 = ZEXT3264(auVar183);
                  local_5b80 = vblendvps_avx(local_5b80,auVar183,_local_5e60);
                  auVar161 = ZEXT3264(local_60c0);
                  iVar94 = 2;
                }
              }
              if ((uint)uVar101 < (uint)POPCOUNT(uVar106)) {
                do {
                  auVar119 = auVar184._0_16_;
                  if ((root.ptr & 8) != 0) {
                    if (root.ptr == 0xfffffffffffffff8) goto LAB_0049a2c0;
                    auVar150 = auVar161._0_32_;
                    auVar134 = vcmpps_avx(local_5b80,auVar150,6);
                    if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar134 >> 0x7f,0) != '\0') ||
                          (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar134 >> 0xbf,0) != '\0') ||
                        (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar134[0x1f] < '\0') {
                      local_5e20 = (ulong)((uint)root.ptr & 0xf) - 8;
                      auVar139 = _local_5e60;
                      if (local_5e20 != 0) {
                        uVar105 = root.ptr & 0xfffffffffffffff0;
                        auVar134 = vcmpps_avx(auVar150,auVar150,0xf);
                        local_5e00._4_4_ = local_5e60._4_4_ ^ auVar134._4_4_;
                        local_5e00._0_4_ = local_5e60._0_4_ ^ auVar134._0_4_;
                        local_5e00._8_4_ = local_5e60._8_4_ ^ auVar134._8_4_;
                        local_5e00._12_4_ = local_5e60._12_4_ ^ auVar134._12_4_;
                        local_5e00._16_4_ = local_5e60._16_4_ ^ auVar134._16_4_;
                        local_5e00._20_4_ = local_5e60._20_4_ ^ auVar134._20_4_;
                        local_5e00._24_4_ = local_5e60._24_4_ ^ auVar134._24_4_;
                        local_5e00._28_4_ = local_5e60._28_4_ ^ auVar134._28_4_;
                        lVar97 = 0;
                        do {
                          local_5e18 = lVar97;
                          lVar97 = lVar97 * 0x90;
                          auVar111._8_8_ = 0;
                          auVar111._0_8_ = *(ulong *)(uVar105 + 0x40 + lVar97);
                          auVar142._8_8_ = 0;
                          auVar142._0_8_ = *(ulong *)(uVar105 + 0x48 + lVar97);
                          auVar119 = vpminub_avx(auVar111,auVar142);
                          auVar119 = vpcmpeqb_avx(auVar111,auVar119);
                          auVar142 = vpcmpeqd_avx(auVar210._0_16_,auVar210._0_16_);
                          auVar210 = ZEXT1664(auVar142);
                          auVar112 = vpmovsxbd_avx(auVar119 ^ auVar142);
                          auVar144._8_8_ = 0;
                          auVar144._0_8_ = *(ulong *)(uVar105 + 0x44 + lVar97);
                          auVar187._8_8_ = 0;
                          auVar187._0_8_ = *(ulong *)(uVar105 + 0x4c + lVar97);
                          auVar119 = vpminub_avx(auVar144,auVar187);
                          auVar111 = vpcmpeqb_avx(auVar144,auVar119);
                          auVar111 = vpmovsxbd_avx(auVar111 ^ auVar142);
                          auVar123._16_16_ = auVar111;
                          auVar123._0_16_ = auVar112;
                          auVar134 = vcvtdq2ps_avx(auVar123);
                          auVar153._8_4_ = 0xbf800000;
                          auVar153._0_8_ = 0xbf800000bf800000;
                          auVar153._12_4_ = 0xbf800000;
                          auVar153._16_4_ = 0xbf800000;
                          auVar153._20_4_ = 0xbf800000;
                          auVar153._24_4_ = 0xbf800000;
                          auVar153._28_4_ = 0xbf800000;
                          auVar134 = vcmpps_avx(auVar153,auVar134,1);
                          uVar92 = vmovmskps_avx(auVar134);
                          if (uVar92 != 0) {
                            lVar97 = lVar97 + uVar105;
                            uVar96 = (ulong)(uVar92 & 0xff);
                            local_5e10 = lVar97;
                            do {
                              lVar100 = 0;
                              if (uVar96 != 0) {
                                for (; (uVar96 >> lVar100 & 1) == 0; lVar100 = lVar100 + 1) {
                                }
                              }
                              auVar112._8_8_ = 0;
                              auVar112._0_8_ = *(ulong *)(lVar97 + 0x40);
                              auVar119 = vpmovzxbd_avx(auVar112);
                              auVar145._8_8_ = 0;
                              auVar145._0_8_ = *(ulong *)(lVar97 + 0x44);
                              auVar111 = vpmovzxbd_avx(auVar145);
                              auVar124._16_16_ = auVar111;
                              auVar124._0_16_ = auVar119;
                              auVar134 = vcvtdq2ps_avx(auVar124);
                              fVar163 = *(float *)(lVar97 + 0x7c);
                              fVar164 = *(float *)(lVar97 + 0x70);
                              local_5b60._4_4_ = fVar164 + fVar163 * auVar134._4_4_;
                              local_5b60._0_4_ = fVar164 + fVar163 * auVar134._0_4_;
                              fStack_5b58 = fVar164 + fVar163 * auVar134._8_4_;
                              fStack_5b54 = fVar164 + fVar163 * auVar134._12_4_;
                              fStack_5b50 = fVar164 + fVar163 * auVar134._16_4_;
                              fStack_5b4c = fVar164 + fVar163 * auVar134._20_4_;
                              fStack_5b48 = fVar164 + fVar163 * auVar134._24_4_;
                              fStack_5b44 = fVar164 + auVar134._28_4_;
                              auVar113._8_8_ = 0;
                              auVar113._0_8_ = *(ulong *)(lVar97 + 0x48);
                              auVar119 = vpmovzxbd_avx(auVar113);
                              auVar188._8_8_ = 0;
                              auVar188._0_8_ = *(ulong *)(lVar97 + 0x4c);
                              auVar111 = vpmovzxbd_avx(auVar188);
                              auVar125._16_16_ = auVar111;
                              auVar125._0_16_ = auVar119;
                              auVar134 = vcvtdq2ps_avx(auVar125);
                              local_5a40 = CONCAT44(fVar164 + fVar163 * auVar134._4_4_,
                                                    fVar164 + fVar163 * auVar134._0_4_);
                              uStack_5a38 = CONCAT44(fVar164 + fVar163 * auVar134._12_4_,
                                                     fVar164 + fVar163 * auVar134._8_4_);
                              uStack_5a30 = CONCAT44(fVar164 + fVar163 * auVar134._20_4_,
                                                     fVar164 + fVar163 * auVar134._16_4_);
                              uStack_5a28 = CONCAT44(fVar164 + auVar134._28_4_,
                                                     fVar164 + fVar163 * auVar134._24_4_);
                              auVar114._8_8_ = 0;
                              auVar114._0_8_ = *(ulong *)(lVar97 + 0x50);
                              auVar119 = vpmovzxbd_avx(auVar114);
                              auVar146._8_8_ = 0;
                              auVar146._0_8_ = *(ulong *)(lVar97 + 0x54);
                              auVar111 = vpmovzxbd_avx(auVar146);
                              auVar126._16_16_ = auVar111;
                              auVar126._0_16_ = auVar119;
                              auVar134 = vcvtdq2ps_avx(auVar126);
                              fVar163 = *(float *)(lVar97 + 0x80);
                              fVar164 = *(float *)(lVar97 + 0x74);
                              local_5fc0._4_4_ = fVar164 + fVar163 * auVar134._4_4_;
                              local_5fc0._0_4_ = fVar164 + fVar163 * auVar134._0_4_;
                              uStack_5fb8 = (void *)CONCAT44(fVar164 + fVar163 * auVar134._12_4_,
                                                             fVar164 + fVar163 * auVar134._8_4_);
                              uStack_5fb0 = (RTCRayQueryContext *)
                                            CONCAT44(fVar164 + fVar163 * auVar134._20_4_,
                                                     fVar164 + fVar163 * auVar134._16_4_);
                              uStack_5fa8 = (RayK<8> *)
                                            CONCAT44(fVar164 + auVar134._28_4_,
                                                     fVar164 + fVar163 * auVar134._24_4_);
                              auVar115._8_8_ = 0;
                              auVar115._0_8_ = *(ulong *)(lVar97 + 0x58);
                              auVar119 = vpmovzxbd_avx(auVar115);
                              auVar189._8_8_ = 0;
                              auVar189._0_8_ = *(ulong *)(lVar97 + 0x5c);
                              auVar111 = vpmovzxbd_avx(auVar189);
                              auVar127._16_16_ = auVar111;
                              auVar127._0_16_ = auVar119;
                              auVar134 = vcvtdq2ps_avx(auVar127);
                              local_5fe0._4_4_ = fVar164 + fVar163 * auVar134._4_4_;
                              local_5fe0._0_4_ = fVar164 + fVar163 * auVar134._0_4_;
                              fStack_5fd8 = fVar164 + fVar163 * auVar134._8_4_;
                              fStack_5fd4 = fVar164 + fVar163 * auVar134._12_4_;
                              auStack_5fd0._0_4_ = fVar164 + fVar163 * auVar134._16_4_;
                              auStack_5fd0._4_4_ = fVar164 + fVar163 * auVar134._20_4_;
                              fStack_5fc8 = fVar164 + fVar163 * auVar134._24_4_;
                              fStack_5fc4 = fVar164 + auVar134._28_4_;
                              auVar116._8_8_ = 0;
                              auVar116._0_8_ = *(ulong *)(lVar97 + 0x60);
                              auVar119 = vpmovzxbd_avx(auVar116);
                              auVar147._8_8_ = 0;
                              auVar147._0_8_ = *(ulong *)(lVar97 + 100);
                              auVar111 = vpmovzxbd_avx(auVar147);
                              auVar128._16_16_ = auVar111;
                              auVar128._0_16_ = auVar119;
                              auVar134 = vcvtdq2ps_avx(auVar128);
                              fVar163 = *(float *)(lVar97 + 0x84);
                              fVar164 = *(float *)(lVar97 + 0x78);
                              local_5dc0 = CONCAT44(fVar164 + fVar163 * auVar134._4_4_,
                                                    fVar164 + fVar163 * auVar134._0_4_);
                              uStack_5db8 = CONCAT44(fVar164 + fVar163 * auVar134._12_4_,
                                                     fVar164 + fVar163 * auVar134._8_4_);
                              fStack_5db0 = fVar164 + fVar163 * auVar134._16_4_;
                              fStack_5dac = fVar164 + fVar163 * auVar134._20_4_;
                              fStack_5da8 = fVar164 + fVar163 * auVar134._24_4_;
                              fStack_5da4 = fVar164 + auVar134._28_4_;
                              auVar117._8_8_ = 0;
                              auVar117._0_8_ = *(ulong *)(lVar97 + 0x68);
                              auVar119 = vpmovzxbd_avx(auVar117);
                              auVar190._8_8_ = 0;
                              auVar190._0_8_ = *(ulong *)(lVar97 + 0x6c);
                              auVar111 = vpmovzxbd_avx(auVar190);
                              auVar129._16_16_ = auVar111;
                              auVar129._0_16_ = auVar119;
                              auVar134 = vcvtdq2ps_avx(auVar129);
                              local_5de0 = CONCAT44(fVar164 + fVar163 * auVar134._4_4_,
                                                    fVar164 + fVar163 * auVar134._0_4_);
                              uStack_5dd8 = CONCAT44(fVar164 + fVar163 * auVar134._12_4_,
                                                     fVar164 + fVar163 * auVar134._8_4_);
                              fStack_5dd0 = fVar164 + fVar163 * auVar134._16_4_;
                              fStack_5dcc = fVar164 + fVar163 * auVar134._20_4_;
                              fStack_5dc8 = fVar164 + fVar163 * auVar134._24_4_;
                              fStack_5dc4 = fVar164 + auVar134._28_4_;
                              uVar106 = *(undefined4 *)(local_5b60 + lVar100 * 4);
                              auVar130._4_4_ = uVar106;
                              auVar130._0_4_ = uVar106;
                              auVar130._8_4_ = uVar106;
                              auVar130._12_4_ = uVar106;
                              auVar130._16_4_ = uVar106;
                              auVar130._20_4_ = uVar106;
                              auVar130._24_4_ = uVar106;
                              auVar130._28_4_ = uVar106;
                              auVar81._8_8_ = local_5d20._8_8_;
                              auVar81._0_8_ = local_5d20._0_8_;
                              auVar81._16_8_ = local_5d20._16_8_;
                              auVar81._24_8_ = local_5d20._24_8_;
                              auVar83._8_8_ = local_5d20._40_8_;
                              auVar83._0_8_ = local_5d20._32_8_;
                              auVar83._16_8_ = local_5d20._48_8_;
                              auVar83._24_8_ = local_5d20._56_8_;
                              auVar85._8_8_ = local_5d20._72_8_;
                              auVar85._0_8_ = local_5d20._64_8_;
                              auVar85._16_8_ = local_5d20._80_8_;
                              auVar85._24_8_ = local_5d20._88_8_;
                              auVar134 = vsubps_avx(auVar130,auVar81);
                              auVar118._0_4_ = (float)local_5c60._0_4_ * auVar134._0_4_;
                              auVar118._4_4_ = (float)local_5c60._4_4_ * auVar134._4_4_;
                              auVar118._8_4_ = fStack_5c58 * auVar134._8_4_;
                              auVar118._12_4_ = fStack_5c54 * auVar134._12_4_;
                              auVar48._16_4_ = fStack_5c50 * auVar134._16_4_;
                              auVar48._0_16_ = auVar118;
                              auVar48._20_4_ = fStack_5c4c * auVar134._20_4_;
                              auVar48._24_4_ = fStack_5c48 * auVar134._24_4_;
                              auVar48._28_4_ = auVar134._28_4_;
                              uVar106 = *(undefined4 *)(local_5fc0 + lVar100 * 4);
                              auVar154._4_4_ = uVar106;
                              auVar154._0_4_ = uVar106;
                              auVar154._8_4_ = uVar106;
                              auVar154._12_4_ = uVar106;
                              auVar154._16_4_ = uVar106;
                              auVar154._20_4_ = uVar106;
                              auVar154._24_4_ = uVar106;
                              auVar154._28_4_ = uVar106;
                              auVar134 = vsubps_avx(auVar154,auVar83);
                              auVar148._0_4_ = (float)local_5c40._0_4_ * auVar134._0_4_;
                              auVar148._4_4_ = (float)local_5c40._4_4_ * auVar134._4_4_;
                              auVar148._8_4_ = fStack_5c38 * auVar134._8_4_;
                              auVar148._12_4_ = fStack_5c34 * auVar134._12_4_;
                              auVar49._16_4_ = fStack_5c30 * auVar134._16_4_;
                              auVar49._0_16_ = auVar148;
                              auVar49._20_4_ = fStack_5c2c * auVar134._20_4_;
                              auVar49._24_4_ = fStack_5c28 * auVar134._24_4_;
                              auVar49._28_4_ = auVar134._28_4_;
                              uVar106 = *(undefined4 *)((long)&local_5dc0 + lVar100 * 4);
                              auVar174._4_4_ = uVar106;
                              auVar174._0_4_ = uVar106;
                              auVar174._8_4_ = uVar106;
                              auVar174._12_4_ = uVar106;
                              auVar174._16_4_ = uVar106;
                              auVar174._20_4_ = uVar106;
                              auVar174._24_4_ = uVar106;
                              auVar174._28_4_ = uVar106;
                              auVar134 = vsubps_avx(auVar174,auVar85);
                              auVar169._0_4_ = (float)local_5c20._0_4_ * auVar134._0_4_;
                              auVar169._4_4_ = (float)local_5c20._4_4_ * auVar134._4_4_;
                              auVar169._8_4_ = fStack_5c18 * auVar134._8_4_;
                              auVar169._12_4_ = fStack_5c14 * auVar134._12_4_;
                              auVar50._16_4_ = fStack_5c10 * auVar134._16_4_;
                              auVar50._0_16_ = auVar169;
                              auVar50._20_4_ = fStack_5c0c * auVar134._20_4_;
                              auVar50._24_4_ = fStack_5c08 * auVar134._24_4_;
                              auVar50._28_4_ = auVar134._28_4_;
                              uVar106 = *(undefined4 *)((long)&local_5a40 + lVar100 * 4);
                              auVar261._4_4_ = uVar106;
                              auVar261._0_4_ = uVar106;
                              auVar261._8_4_ = uVar106;
                              auVar261._12_4_ = uVar106;
                              auVar261._16_4_ = uVar106;
                              auVar261._20_4_ = uVar106;
                              auVar261._24_4_ = uVar106;
                              auVar261._28_4_ = uVar106;
                              auVar134 = vsubps_avx(auVar261,auVar81);
                              auVar191._0_4_ = (float)local_5c60._0_4_ * auVar134._0_4_;
                              auVar191._4_4_ = (float)local_5c60._4_4_ * auVar134._4_4_;
                              auVar191._8_4_ = fStack_5c58 * auVar134._8_4_;
                              auVar191._12_4_ = fStack_5c54 * auVar134._12_4_;
                              auVar51._16_4_ = fStack_5c50 * auVar134._16_4_;
                              auVar51._0_16_ = auVar191;
                              auVar51._20_4_ = fStack_5c4c * auVar134._20_4_;
                              auVar51._24_4_ = fStack_5c48 * auVar134._24_4_;
                              auVar51._28_4_ = auVar134._28_4_;
                              uVar106 = *(undefined4 *)(local_5fe0 + lVar100 * 4);
                              auVar233._4_4_ = uVar106;
                              auVar233._0_4_ = uVar106;
                              auVar233._8_4_ = uVar106;
                              auVar233._12_4_ = uVar106;
                              auVar233._16_4_ = uVar106;
                              auVar233._20_4_ = uVar106;
                              auVar233._24_4_ = uVar106;
                              auVar233._28_4_ = uVar106;
                              auVar134 = vsubps_avx(auVar233,auVar83);
                              auVar205._0_4_ = (float)local_5c40._0_4_ * auVar134._0_4_;
                              auVar205._4_4_ = (float)local_5c40._4_4_ * auVar134._4_4_;
                              auVar205._8_4_ = fStack_5c38 * auVar134._8_4_;
                              auVar205._12_4_ = fStack_5c34 * auVar134._12_4_;
                              auVar52._16_4_ = fStack_5c30 * auVar134._16_4_;
                              auVar52._0_16_ = auVar205;
                              auVar52._20_4_ = fStack_5c2c * auVar134._20_4_;
                              auVar52._24_4_ = fStack_5c28 * auVar134._24_4_;
                              auVar52._28_4_ = auVar134._28_4_;
                              auVar210 = ZEXT3264(auVar52);
                              uVar106 = *(undefined4 *)((long)&local_5de0 + lVar100 * 4);
                              auVar234._4_4_ = uVar106;
                              auVar234._0_4_ = uVar106;
                              auVar234._8_4_ = uVar106;
                              auVar234._12_4_ = uVar106;
                              auVar234._16_4_ = uVar106;
                              auVar234._20_4_ = uVar106;
                              auVar234._24_4_ = uVar106;
                              auVar234._28_4_ = uVar106;
                              auVar134 = vsubps_avx(auVar234,auVar85);
                              auVar223._0_4_ = (float)local_5c20._0_4_ * auVar134._0_4_;
                              auVar223._4_4_ = (float)local_5c20._4_4_ * auVar134._4_4_;
                              auVar223._8_4_ = fStack_5c18 * auVar134._8_4_;
                              auVar223._12_4_ = fStack_5c14 * auVar134._12_4_;
                              auVar53._16_4_ = fStack_5c10 * auVar134._16_4_;
                              auVar53._0_16_ = auVar223;
                              auVar53._20_4_ = fStack_5c0c * auVar134._20_4_;
                              auVar53._24_4_ = fStack_5c08 * auVar134._24_4_;
                              auVar53._28_4_ = auVar134._28_4_;
                              auVar119 = vpminsd_avx(auVar48._16_16_,auVar51._16_16_);
                              auVar111 = vpminsd_avx(auVar118,auVar191);
                              auVar142 = vpminsd_avx(auVar49._16_16_,auVar52._16_16_);
                              auVar119 = vpmaxsd_avx(auVar119,auVar142);
                              auVar142 = vpminsd_avx(auVar148,auVar205);
                              auVar111 = vpmaxsd_avx(auVar111,auVar142);
                              auVar142 = vpminsd_avx(auVar169,auVar223);
                              auVar111 = vpmaxsd_avx(auVar111,auVar142);
                              auVar187 = auVar53._16_16_;
                              auVar184 = ZEXT1664(auVar187);
                              auVar142 = vpminsd_avx(auVar50._16_16_,auVar187);
                              auVar142 = vpmaxsd_avx(auVar119,auVar142);
                              auVar119 = vpmaxsd_avx(auVar111,local_5ba0._0_16_);
                              auVar111 = vpmaxsd_avx(auVar142,local_5ba0._16_16_);
                              auVar142 = vpmaxsd_avx(auVar48._16_16_,auVar51._16_16_);
                              auVar112 = vpmaxsd_avx(auVar118,auVar191);
                              auVar144 = vpmaxsd_avx(auVar49._16_16_,auVar52._16_16_);
                              auVar144 = vpminsd_avx(auVar142,auVar144);
                              auVar142 = vpmaxsd_avx(auVar148,auVar205);
                              auVar112 = vpminsd_avx(auVar112,auVar142);
                              auVar142 = vpmaxsd_avx(auVar169,auVar223);
                              auVar112 = vpminsd_avx(auVar112,auVar142);
                              auVar142 = vpmaxsd_avx(auVar50._16_16_,auVar187);
                              auVar142 = vpminsd_avx(auVar144,auVar142);
                              auVar112 = vpminsd_avx(auVar112,local_5b80._0_16_);
                              auVar142 = vpminsd_avx(auVar142,local_5b80._16_16_);
                              auVar175._16_16_ = auVar111;
                              auVar175._0_16_ = auVar119;
                              auVar131._16_16_ = auVar142;
                              auVar131._0_16_ = auVar112;
                              auVar134 = vcmpps_avx(auVar175,auVar131,2);
                              auVar161 = ZEXT3264(local_5e00);
                              auVar150 = local_5e00 & auVar134;
                              if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar150 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar150 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar150 >> 0x7f,0) == '\0')
                                    && (auVar150 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar150 >> 0xbf,0) == '\0')
                                  && (auVar150 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar150[0x1f]) {
                                bVar109 = false;
                                auVar150 = local_5e00;
                              }
                              else {
                                local_5e08 = uVar96;
                                uVar5 = *(ushort *)(lVar97 + lVar100 * 8);
                                uVar6 = *(ushort *)(lVar97 + 2 + lVar100 * 8);
                                uVar92 = *(uint *)(lVar97 + 0x88);
                                uVar238 = *(uint *)(lVar97 + 4 + lVar100 * 8);
                                pGVar7 = (context->scene->geometries).items[uVar92].ptr;
                                lVar100 = *(long *)&pGVar7->field_0x58;
                                lVar8 = *(long *)&pGVar7[1].time_range.upper;
                                lVar102 = (ulong)uVar238 *
                                          pGVar7[1].super_RefCount.refCounter.
                                          super___atomic_base<unsigned_long>._M_i;
                                uVar93 = uVar5 & 0x7fff;
                                uVar95 = uVar6 & 0x7fff;
                                uVar240 = *(uint *)(lVar100 + 4 + lVar102);
                                uVar96 = (ulong)uVar240;
                                uVar107 = (ulong)(uVar240 * uVar95 +
                                                 *(int *)(lVar100 + lVar102) + uVar93);
                                p_Var9 = pGVar7[1].intersectionFilterN;
                                puVar1 = (undefined8 *)(lVar8 + (long)p_Var9 * uVar107);
                                puVar2 = (undefined8 *)(lVar8 + (uVar107 + 1) * (long)p_Var9);
                                uStack_5a30 = *puVar2;
                                uStack_5a28 = puVar2[1];
                                lVar97 = uVar107 + uVar96;
                                puVar2 = (undefined8 *)(lVar8 + lVar97 * (long)p_Var9);
                                local_5a10 = *puVar2;
                                uStack_5a08 = puVar2[1];
                                lVar103 = uVar107 + uVar96 + 1;
                                puVar2 = (undefined8 *)(lVar8 + lVar103 * (long)p_Var9);
                                local_5a20 = *puVar2;
                                uStack_5a18 = puVar2[1];
                                uVar101 = (ulong)(-1 < (short)uVar5);
                                puVar2 = (undefined8 *)
                                         (lVar8 + (uVar107 + uVar101 + 1) * (long)p_Var9);
                                lVar98 = uVar101 + lVar103;
                                puVar3 = (undefined8 *)(lVar8 + lVar98 * (long)p_Var9);
                                local_59e0 = *puVar3;
                                uStack_59d8 = puVar3[1];
                                if ((short)uVar6 < 0) {
                                  uVar96 = 0;
                                }
                                puVar3 = (undefined8 *)(lVar8 + (lVar97 + uVar96) * (long)p_Var9);
                                puVar4 = (undefined8 *)(lVar8 + (lVar103 + uVar96) * (long)p_Var9);
                                local_59a0 = *puVar4;
                                uStack_5998 = puVar4[1];
                                puVar4 = (undefined8 *)(lVar8 + (uVar96 + lVar98) * (long)p_Var9);
                                local_5a40 = *puVar1;
                                uStack_5a38 = puVar1[1];
                                local_5a00 = uStack_5a30;
                                uStack_59f8 = uStack_5a28;
                                local_59f0 = *puVar2;
                                uStack_59e8 = puVar2[1];
                                local_59d0 = local_5a20;
                                uStack_59c8 = uStack_5a18;
                                local_59c0 = local_5a10;
                                uStack_59b8 = uStack_5a08;
                                local_59b0 = local_5a20;
                                uStack_59a8 = uStack_5a18;
                                local_5990 = *puVar3;
                                uStack_5988 = puVar3[1];
                                local_5980 = local_5a20;
                                uStack_5978 = uStack_5a18;
                                local_5970 = local_59e0;
                                uStack_5968 = uStack_59d8;
                                local_5960 = *puVar4;
                                uStack_5958 = puVar4[1];
                                local_5950 = local_59a0;
                                uStack_5948 = uStack_5998;
                                local_5d30 = vshufps_avx(ZEXT416(uVar92),ZEXT416(uVar92),0);
                                local_5d40 = vshufps_avx(ZEXT416(uVar238),ZEXT416(uVar238),0);
                                pfVar99 = (float *)&uStack_5a08;
                                uVar101 = 0;
                                local_60c8 = lVar102;
                                local_6068 = lVar100;
                                do {
                                  local_60c0 = auVar161._0_32_;
                                  fVar163 = pfVar99[-0xe];
                                  auVar199._4_4_ = fVar163;
                                  auVar199._0_4_ = fVar163;
                                  auVar199._8_4_ = fVar163;
                                  auVar199._12_4_ = fVar163;
                                  auVar199._16_4_ = fVar163;
                                  auVar199._20_4_ = fVar163;
                                  auVar199._24_4_ = fVar163;
                                  auVar199._28_4_ = fVar163;
                                  fVar164 = pfVar99[-0xd];
                                  auVar208._4_4_ = fVar164;
                                  auVar208._0_4_ = fVar164;
                                  auVar208._8_4_ = fVar164;
                                  auVar208._12_4_ = fVar164;
                                  auVar208._16_4_ = fVar164;
                                  auVar208._20_4_ = fVar164;
                                  auVar208._24_4_ = fVar164;
                                  auVar208._28_4_ = fVar164;
                                  fVar165 = pfVar99[-0xc];
                                  auVar228._4_4_ = fVar165;
                                  auVar228._0_4_ = fVar165;
                                  auVar228._8_4_ = fVar165;
                                  auVar228._12_4_ = fVar165;
                                  auVar228._16_4_ = fVar165;
                                  auVar228._20_4_ = fVar165;
                                  auVar228._24_4_ = fVar165;
                                  auVar228._28_4_ = fVar165;
                                  local_5d60._4_4_ = pfVar99[-10];
                                  local_5d80._4_4_ = pfVar99[-9];
                                  local_5da0._4_4_ = pfVar99[-8];
                                  local_5840 = pfVar99[-2];
                                  local_5860 = pfVar99[-1];
                                  local_5880 = *pfVar99;
                                  local_5d60._0_4_ = local_5d60._4_4_;
                                  fStack_5d58 = (float)local_5d60._4_4_;
                                  fStack_5d54 = (float)local_5d60._4_4_;
                                  fStack_5d50 = (float)local_5d60._4_4_;
                                  fStack_5d4c = (float)local_5d60._4_4_;
                                  fStack_5d48 = (float)local_5d60._4_4_;
                                  fStack_5d44 = (float)local_5d60._4_4_;
                                  fVar41 = fVar163 - (float)local_5d60._4_4_;
                                  local_5d80._0_4_ = local_5d80._4_4_;
                                  fStack_5d78 = (float)local_5d80._4_4_;
                                  fStack_5d74 = (float)local_5d80._4_4_;
                                  fStack_5d70 = (float)local_5d80._4_4_;
                                  fStack_5d6c = (float)local_5d80._4_4_;
                                  fStack_5d68 = (float)local_5d80._4_4_;
                                  fStack_5d64 = (float)local_5d80._4_4_;
                                  fVar219 = fVar164 - (float)local_5d80._4_4_;
                                  local_5da0._0_4_ = local_5da0._4_4_;
                                  fStack_5d98 = (float)local_5da0._4_4_;
                                  fStack_5d94 = (float)local_5da0._4_4_;
                                  fStack_5d90 = (float)local_5da0._4_4_;
                                  fStack_5d8c = (float)local_5da0._4_4_;
                                  fStack_5d88 = (float)local_5da0._4_4_;
                                  fStack_5d84 = (float)local_5da0._4_4_;
                                  fVar221 = fVar165 - (float)local_5da0._4_4_;
                                  fStack_585c = local_5860;
                                  fStack_5858 = local_5860;
                                  fStack_5854 = local_5860;
                                  fStack_5850 = local_5860;
                                  fStack_584c = local_5860;
                                  fStack_5848 = local_5860;
                                  fStack_5844 = local_5860;
                                  fVar164 = local_5860 - fVar164;
                                  fStack_587c = local_5880;
                                  fStack_5878 = local_5880;
                                  fStack_5874 = local_5880;
                                  fStack_5870 = local_5880;
                                  fStack_586c = local_5880;
                                  fStack_5868 = local_5880;
                                  fStack_5864 = local_5880;
                                  fVar165 = local_5880 - fVar165;
                                  fStack_583c = local_5840;
                                  fStack_5838 = local_5840;
                                  fStack_5834 = local_5840;
                                  fStack_5830 = local_5840;
                                  fStack_582c = local_5840;
                                  fStack_5828 = local_5840;
                                  fStack_5824 = local_5840;
                                  fVar163 = local_5840 - fVar163;
                                  local_6080 = ZEXT416((uint)fVar41);
                                  local_6040 = ZEXT416((uint)fVar219);
                                  local_5dc0 = local_5d30._0_8_;
                                  uStack_5db8 = local_5d30._8_8_;
                                  local_5de0 = local_5d40._0_8_;
                                  uStack_5dd8 = local_5d40._8_8_;
                                  local_5920 = vsubps_avx(auVar199,*(undefined1 (*) [32])ray);
                                  auVar178 = vsubps_avx(auVar208,*(undefined1 (*) [32])(ray + 0x20))
                                  ;
                                  auVar134 = vsubps_avx(auVar228,*(undefined1 (*) [32])(ray + 0x40))
                                  ;
                                  fVar13 = *(float *)(ray + 0xa0);
                                  fVar14 = *(float *)(ray + 0xa4);
                                  fVar15 = *(float *)(ray + 0xa8);
                                  fVar16 = *(float *)(ray + 0xac);
                                  fVar18 = *(float *)(ray + 0xb0);
                                  fVar19 = *(float *)(ray + 0xb4);
                                  fVar20 = *(float *)(ray + 0xb8);
                                  fVar21 = *(float *)(ray + 0xc0);
                                  fVar22 = *(float *)(ray + 0xc4);
                                  fVar23 = *(float *)(ray + 200);
                                  fVar25 = *(float *)(ray + 0xcc);
                                  fVar26 = *(float *)(ray + 0xd0);
                                  fVar27 = *(float *)(ray + 0xd4);
                                  fVar28 = *(float *)(ray + 0xd8);
                                  fVar280 = auVar134._0_4_;
                                  auVar264._0_4_ = fVar280 * fVar13;
                                  fVar282 = auVar134._4_4_;
                                  auVar264._4_4_ = fVar282 * fVar14;
                                  fVar284 = auVar134._8_4_;
                                  auVar264._8_4_ = fVar284 * fVar15;
                                  fVar286 = auVar134._12_4_;
                                  auVar264._12_4_ = fVar286 * fVar16;
                                  fVar288 = auVar134._16_4_;
                                  auVar264._16_4_ = fVar288 * fVar18;
                                  fVar290 = auVar134._20_4_;
                                  auVar264._20_4_ = fVar290 * fVar19;
                                  fVar292 = auVar134._24_4_;
                                  auVar264._24_4_ = fVar292 * fVar20;
                                  auVar264._28_4_ = 0;
                                  fVar166 = auVar178._0_4_;
                                  auVar210._0_4_ = fVar21 * fVar166;
                                  fVar262 = auVar178._4_4_;
                                  auVar210._4_4_ = fVar22 * fVar262;
                                  fVar141 = auVar178._8_4_;
                                  auVar210._8_4_ = fVar23 * fVar141;
                                  fVar11 = auVar178._12_4_;
                                  auVar210._12_4_ = fVar25 * fVar11;
                                  fVar17 = auVar178._16_4_;
                                  auVar210._16_4_ = fVar26 * fVar17;
                                  fVar217 = auVar178._20_4_;
                                  auVar210._20_4_ = fVar27 * fVar217;
                                  fVar31 = auVar178._24_4_;
                                  auVar210._28_36_ = auVar184._28_36_;
                                  auVar210._24_4_ = fVar28 * fVar31;
                                  auVar150 = vsubps_avx(auVar210._0_32_,auVar264);
                                  fVar29 = *(float *)(ray + 0x80);
                                  fVar30 = *(float *)(ray + 0x84);
                                  fVar33 = *(float *)(ray + 0x88);
                                  fVar34 = *(float *)(ray + 0x8c);
                                  fVar35 = *(float *)(ray + 0x90);
                                  fVar36 = *(float *)(ray + 0x94);
                                  fVar37 = *(float *)(ray + 0x98);
                                  fVar167 = local_5920._0_4_;
                                  fVar212 = local_5920._4_4_;
                                  auVar54._4_4_ = fVar22 * fVar212;
                                  auVar54._0_4_ = fVar21 * fVar167;
                                  fVar162 = local_5920._8_4_;
                                  auVar54._8_4_ = fVar23 * fVar162;
                                  fVar12 = local_5920._12_4_;
                                  auVar54._12_4_ = fVar25 * fVar12;
                                  fVar215 = local_5920._16_4_;
                                  auVar54._16_4_ = fVar26 * fVar215;
                                  fVar24 = local_5920._20_4_;
                                  auVar54._20_4_ = fVar27 * fVar24;
                                  fVar32 = local_5920._24_4_;
                                  auVar54._24_4_ = fVar28 * fVar32;
                                  auVar54._28_4_ = 0;
                                  auVar55._4_4_ = fVar282 * fVar30;
                                  auVar55._0_4_ = fVar280 * fVar29;
                                  auVar55._8_4_ = fVar284 * fVar33;
                                  auVar55._12_4_ = fVar286 * fVar34;
                                  auVar55._16_4_ = fVar288 * fVar35;
                                  auVar55._20_4_ = fVar290 * fVar36;
                                  auVar55._24_4_ = fVar292 * fVar37;
                                  auVar55._28_4_ = auVar184._28_4_;
                                  local_5e80 = vsubps_avx(auVar55,auVar54);
                                  auVar56._4_4_ = fVar262 * fVar30;
                                  auVar56._0_4_ = fVar166 * fVar29;
                                  auVar56._8_4_ = fVar141 * fVar33;
                                  auVar56._12_4_ = fVar11 * fVar34;
                                  auVar56._16_4_ = fVar17 * fVar35;
                                  auVar56._20_4_ = fVar217 * fVar36;
                                  auVar56._24_4_ = fVar31 * fVar37;
                                  auVar56._28_4_ = auVar184._28_4_;
                                  auVar57._4_4_ = fVar14 * fVar212;
                                  auVar57._0_4_ = fVar13 * fVar167;
                                  auVar57._8_4_ = fVar15 * fVar162;
                                  auVar57._12_4_ = fVar16 * fVar12;
                                  auVar57._16_4_ = fVar18 * fVar215;
                                  auVar57._20_4_ = fVar19 * fVar24;
                                  auVar57._24_4_ = fVar20 * fVar32;
                                  auVar57._28_4_ = local_5920._28_4_;
                                  local_5900 = vsubps_avx(auVar57,auVar56);
                                  auVar119 = ZEXT416((uint)(fVar165 * fVar41 - fVar163 * fVar221));
                                  auVar119 = vshufps_avx(auVar119,auVar119,0);
                                  auVar111 = ZEXT416((uint)(fVar163 * fVar219 - fVar41 * fVar164));
                                  auVar111 = vshufps_avx(auVar111,auVar111,0);
                                  auVar270._16_16_ = auVar111;
                                  auVar270._0_16_ = auVar111;
                                  fVar268 = auVar111._0_4_;
                                  fVar271 = auVar111._4_4_;
                                  fVar273 = auVar111._8_4_;
                                  fVar263 = auVar119._0_4_;
                                  fVar266 = auVar119._4_4_;
                                  fVar267 = auVar119._8_4_;
                                  auVar142 = vpermilps_avx(ZEXT416((uint)(fVar221 * fVar164 -
                                                                         fVar165 * fVar219)),0);
                                  auVar294._16_16_ = auVar142;
                                  auVar294._0_16_ = auVar142;
                                  fVar41 = auVar142._12_4_;
                                  auVar298 = ZEXT436((uint)fVar41);
                                  fVar219 = auVar142._0_4_;
                                  fVar296 = auVar142._4_4_;
                                  fVar297 = auVar142._8_4_;
                                  auVar235._0_4_ =
                                       fVar219 * fVar29 + fVar263 * fVar13 + fVar268 * fVar21;
                                  auVar235._4_4_ =
                                       fVar296 * fVar30 + fVar266 * fVar14 + fVar271 * fVar22;
                                  auVar235._8_4_ =
                                       fVar297 * fVar33 + fVar267 * fVar15 + fVar273 * fVar23;
                                  auVar235._12_4_ =
                                       fVar41 * fVar34 +
                                       auVar119._12_4_ * fVar16 + auVar111._12_4_ * fVar25;
                                  auVar235._16_4_ =
                                       fVar219 * fVar35 + fVar263 * fVar18 + fVar268 * fVar26;
                                  auVar235._20_4_ =
                                       fVar296 * fVar36 + fVar266 * fVar19 + fVar271 * fVar27;
                                  auVar235._24_4_ =
                                       fVar297 * fVar37 + fVar267 * fVar20 + fVar273 * fVar28;
                                  auVar235._28_4_ =
                                       *(float *)(ray + 0x9c) + *(float *)(ray + 0xdc) + 0.0;
                                  auVar142 = vshufps_avx(ZEXT416((uint)fVar164),
                                                         ZEXT416((uint)fVar164),0);
                                  auVar112 = vshufps_avx(ZEXT416((uint)fVar165),
                                                         ZEXT416((uint)fVar165),0);
                                  auVar144 = vshufps_avx(ZEXT416((uint)fVar163),
                                                         ZEXT416((uint)fVar163),0);
                                  auVar155._8_4_ = 0x80000000;
                                  auVar155._0_8_ = 0x8000000080000000;
                                  auVar155._12_4_ = 0x80000000;
                                  auVar155._16_4_ = 0x80000000;
                                  auVar155._20_4_ = 0x80000000;
                                  auVar155._24_4_ = 0x80000000;
                                  auVar155._28_4_ = 0x80000000;
                                  auVar134 = vandps_avx(auVar235,auVar155);
                                  uVar92 = auVar134._0_4_;
                                  auVar132._0_4_ =
                                       uVar92 ^ (uint)(auVar144._0_4_ * auVar150._0_4_ +
                                                      auVar142._0_4_ * local_5e80._0_4_ +
                                                      auVar112._0_4_ * local_5900._0_4_);
                                  uVar238 = auVar134._4_4_;
                                  auVar132._4_4_ =
                                       uVar238 ^ (uint)(auVar144._4_4_ * auVar150._4_4_ +
                                                       auVar142._4_4_ * local_5e80._4_4_ +
                                                       auVar112._4_4_ * local_5900._4_4_);
                                  uVar240 = auVar134._8_4_;
                                  auVar132._8_4_ =
                                       uVar240 ^ (uint)(auVar144._8_4_ * auVar150._8_4_ +
                                                       auVar142._8_4_ * local_5e80._8_4_ +
                                                       auVar112._8_4_ * local_5900._8_4_);
                                  uVar242 = auVar134._12_4_;
                                  auVar132._12_4_ =
                                       uVar242 ^ (uint)(auVar144._12_4_ * auVar150._12_4_ +
                                                       auVar142._12_4_ * local_5e80._12_4_ +
                                                       auVar112._12_4_ * local_5900._12_4_);
                                  uVar244 = auVar134._16_4_;
                                  auVar132._16_4_ =
                                       uVar244 ^ (uint)(auVar144._0_4_ * auVar150._16_4_ +
                                                       auVar142._0_4_ * local_5e80._16_4_ +
                                                       auVar112._0_4_ * local_5900._16_4_);
                                  uVar246 = auVar134._20_4_;
                                  auVar132._20_4_ =
                                       uVar246 ^ (uint)(auVar144._4_4_ * auVar150._20_4_ +
                                                       auVar142._4_4_ * local_5e80._20_4_ +
                                                       auVar112._4_4_ * local_5900._20_4_);
                                  uVar248 = auVar134._24_4_;
                                  auVar132._24_4_ =
                                       uVar248 ^ (uint)(auVar144._8_4_ * auVar150._24_4_ +
                                                       auVar142._8_4_ * local_5e80._24_4_ +
                                                       auVar112._8_4_ * local_5900._24_4_);
                                  uVar250 = auVar134._28_4_;
                                  auVar132._28_4_ =
                                       uVar250 ^ (uint)(auVar144._12_4_ +
                                                       auVar142._12_4_ + auVar112._12_4_);
                                  auVar134 = vcmpps_avx(auVar132,_DAT_02020f00,5);
                                  auVar196 = local_60c0 & auVar134;
                                  local_58a0 = pfVar99[-6];
                                  fStack_589c = local_58a0;
                                  fStack_5898 = local_58a0;
                                  fStack_5894 = local_58a0;
                                  fStack_5890 = local_58a0;
                                  fStack_588c = local_58a0;
                                  fStack_5888 = local_58a0;
                                  fStack_5884 = local_58a0;
                                  local_58c0 = pfVar99[-5];
                                  fStack_58bc = local_58c0;
                                  fStack_58b8 = local_58c0;
                                  fStack_58b4 = local_58c0;
                                  fStack_58b0 = local_58c0;
                                  fStack_58ac = local_58c0;
                                  fStack_58a8 = local_58c0;
                                  fStack_58a4 = local_58c0;
                                  local_58e0 = pfVar99[-4];
                                  fStack_58dc = local_58e0;
                                  fStack_58d8 = local_58e0;
                                  fStack_58d4 = local_58e0;
                                  fStack_58d0 = local_58e0;
                                  fStack_58cc = local_58e0;
                                  fStack_58c8 = local_58e0;
                                  fStack_58c4 = local_58e0;
                                  local_5ee0._0_8_ = local_5ea0._0_8_;
                                  local_5ee0._8_8_ = local_5ea0._8_8_;
                                  local_5ee0._16_8_ = local_5ea0._16_8_;
                                  local_5ee0._24_8_ = local_5ea0._24_8_;
                                  if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar196 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar196 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar196 >> 0x7f,0) == '\0') &&
                                        (auVar196 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar196 >> 0xbf,0) == '\0'
                                       ) && (auVar196 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar196[0x1f]) {
LAB_0049942a:
                                    auVar133._8_8_ = uStack_5ef8;
                                    auVar133._0_8_ = local_5f00;
                                    auVar133._16_8_ = uStack_5ef0;
                                    auVar133._24_8_ = uStack_5ee8;
                                    auVar185 = ZEXT436(auVar178._28_4_);
                                    _local_6000 = local_5f60;
                                    auVar270 = local_5ec0;
                                    auVar178 = local_5f80;
                                  }
                                  else {
                                    auVar142 = vpermilps_avx(local_6080,0);
                                    auVar112 = vpermilps_avx(local_6040,0);
                                    auVar144 = vpermilps_avx(ZEXT416((uint)fVar221),0);
                                    auVar196 = vandps_avx(auVar134,local_60c0);
                                    auVar178._0_4_ =
                                         auVar144._0_4_ * local_5900._0_4_ +
                                         auVar112._0_4_ * local_5e80._0_4_;
                                    auVar178._4_4_ =
                                         auVar144._4_4_ * local_5900._4_4_ +
                                         auVar112._4_4_ * local_5e80._4_4_;
                                    auVar178._8_4_ =
                                         auVar144._8_4_ * local_5900._8_4_ +
                                         auVar112._8_4_ * local_5e80._8_4_;
                                    auVar178._12_4_ =
                                         auVar144._12_4_ * local_5900._12_4_ +
                                         auVar112._12_4_ * local_5e80._12_4_;
                                    auVar178._16_4_ =
                                         auVar144._0_4_ * local_5900._16_4_ +
                                         auVar112._0_4_ * local_5e80._16_4_;
                                    auVar178._20_4_ =
                                         auVar144._4_4_ * local_5900._20_4_ +
                                         auVar112._4_4_ * local_5e80._20_4_;
                                    auVar178._24_4_ =
                                         auVar144._8_4_ * local_5900._24_4_ +
                                         auVar112._8_4_ * local_5e80._24_4_;
                                    auVar178._28_4_ = auVar134._28_4_ + auVar112._12_4_;
                                    auVar265._0_4_ =
                                         uVar92 ^ (uint)(auVar150._0_4_ * auVar142._0_4_ +
                                                        auVar178._0_4_);
                                    auVar265._4_4_ =
                                         uVar238 ^ (uint)(auVar150._4_4_ * auVar142._4_4_ +
                                                         auVar178._4_4_);
                                    auVar265._8_4_ =
                                         uVar240 ^ (uint)(auVar150._8_4_ * auVar142._8_4_ +
                                                         auVar178._8_4_);
                                    auVar265._12_4_ =
                                         uVar242 ^ (uint)(auVar150._12_4_ * auVar142._12_4_ +
                                                         auVar178._12_4_);
                                    auVar265._16_4_ =
                                         uVar244 ^ (uint)(auVar150._16_4_ * auVar142._0_4_ +
                                                         auVar178._16_4_);
                                    auVar265._20_4_ =
                                         uVar246 ^ (uint)(auVar150._20_4_ * auVar142._4_4_ +
                                                         auVar178._20_4_);
                                    auVar265._24_4_ =
                                         uVar248 ^ (uint)(auVar150._24_4_ * auVar142._8_4_ +
                                                         auVar178._24_4_);
                                    auVar265._28_4_ =
                                         uVar250 ^ (uint)(auVar142._12_4_ + auVar178._28_4_);
                                    auVar134 = vcmpps_avx(auVar265,_DAT_02020f00,5);
                                    auVar150 = auVar196 & auVar134;
                                    if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar150 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar150 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar150 >> 0x7f,0) == '\0') &&
                                          (auVar150 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar150 >> 0xbf,0) == '\0') &&
                                        (auVar150 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar150[0x1f])
                                    goto LAB_0049942a;
                                    auVar181._8_4_ = 0x7fffffff;
                                    auVar181._0_8_ = 0x7fffffff7fffffff;
                                    auVar181._12_4_ = 0x7fffffff;
                                    auVar181._16_4_ = 0x7fffffff;
                                    auVar181._20_4_ = 0x7fffffff;
                                    auVar181._24_4_ = 0x7fffffff;
                                    auVar181._28_4_ = 0x7fffffff;
                                    auVar178 = vandps_avx(auVar235,auVar181);
                                    auVar134 = vandps_avx(auVar134,auVar196);
                                    auVar150 = vsubps_avx(auVar178,auVar132);
                                    auVar150 = vcmpps_avx(auVar150,auVar265,5);
                                    auVar196 = auVar134 & auVar150;
                                    if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar196 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar196 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar196 >> 0x7f,0) == '\0') &&
                                          (auVar196 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar196 >> 0xbf,0) == '\0') &&
                                        (auVar196 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar196[0x1f])
                                    goto LAB_0049942a;
                                    auVar134 = vandps_avx(auVar150,auVar134);
                                    fVar163 = auVar178._28_4_;
                                    fVar164 = fVar163 + fVar163 + auVar150._28_4_;
                                    local_6000._0_4_ =
                                         uVar92 ^ (uint)(fVar219 * fVar167 +
                                                        fVar166 * fVar263 + fVar268 * fVar280);
                                    local_6000._4_4_ =
                                         uVar238 ^ (uint)(fVar296 * fVar212 +
                                                         fVar262 * fVar266 + fVar271 * fVar282);
                                    fStack_5ff8 = (float)(uVar240 ^
                                                         (uint)(fVar297 * fVar162 +
                                                               fVar141 * fVar267 + fVar273 * fVar284
                                                               ));
                                    fStack_5ff4 = (float)(uVar242 ^
                                                         (uint)(fVar41 * fVar12 +
                                                               fVar11 * auVar119._12_4_ +
                                                               auVar111._12_4_ * fVar286));
                                    fStack_5ff0 = (float)(uVar244 ^
                                                         (uint)(fVar219 * fVar215 +
                                                               fVar17 * fVar263 + fVar268 * fVar288)
                                                         );
                                    fStack_5fec = (float)(uVar246 ^
                                                         (uint)(fVar296 * fVar24 +
                                                               fVar217 * fVar266 + fVar271 * fVar290
                                                               ));
                                    fStack_5fe8 = (float)(uVar248 ^
                                                         (uint)(fVar297 * fVar32 +
                                                               fVar31 * fVar267 + fVar273 * fVar292)
                                                         );
                                    register0x000012dc = uVar250 ^ (uint)fVar164;
                                    auVar78._4_4_ = auVar178._4_4_ * *(float *)(ray + 100);
                                    auVar78._0_4_ = auVar178._0_4_ * *(float *)(ray + 0x60);
                                    auVar78._8_4_ = auVar178._8_4_ * *(float *)(ray + 0x68);
                                    auVar78._12_4_ = auVar178._12_4_ * *(float *)(ray + 0x6c);
                                    auVar78._16_4_ = auVar178._16_4_ * *(float *)(ray + 0x70);
                                    auVar78._20_4_ = auVar178._20_4_ * *(float *)(ray + 0x74);
                                    auVar78._24_4_ = auVar178._24_4_ * *(float *)(ray + 0x78);
                                    auVar78._28_4_ = fVar164;
                                    auVar79._4_4_ = auVar178._4_4_ * *(float *)(ray + 0x104);
                                    auVar79._0_4_ = auVar178._0_4_ * *(float *)(ray + 0x100);
                                    auVar79._8_4_ = auVar178._8_4_ * *(float *)(ray + 0x108);
                                    auVar79._12_4_ = auVar178._12_4_ * *(float *)(ray + 0x10c);
                                    auVar79._16_4_ = auVar178._16_4_ * *(float *)(ray + 0x110);
                                    auVar79._20_4_ = auVar178._20_4_ * *(float *)(ray + 0x114);
                                    auVar79._24_4_ = auVar178._24_4_ * *(float *)(ray + 0x118);
                                    auVar79._28_4_ = fVar163;
                                    auVar150 = vcmpps_avx(auVar78,_local_6000,1);
                                    auVar196 = vcmpps_avx(_local_6000,auVar79,2);
                                    auVar185 = ZEXT436(auVar196._28_4_);
                                    auVar150 = vandps_avx(auVar196,auVar150);
                                    auVar196 = auVar134 & auVar150;
                                    if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar196 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar196 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar196 >> 0x7f,0) == '\0') &&
                                          (auVar196 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar196 >> 0xbf,0) == '\0') &&
                                        (auVar196 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar196[0x1f]) {
LAB_0049a195:
                                      auVar133._8_8_ = uStack_5ef8;
                                      auVar133._0_8_ = local_5f00;
                                      auVar133._16_8_ = uStack_5ef0;
                                      auVar133._24_8_ = uStack_5ee8;
                                      _local_6000 = local_5f60;
                                      auVar270 = local_5ec0;
                                      auVar178 = local_5f80;
                                    }
                                    else {
                                      auVar134 = vandps_avx(auVar150,auVar134);
                                      auVar150 = vcmpps_avx(auVar235,_DAT_02020f00,4);
                                      auVar196 = auVar134 & auVar150;
                                      if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar196 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar196 >> 0x5f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar196 >> 0x7f,0) == '\0') &&
                                            (auVar196 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar196 >> 0xbf,0) == '\0') &&
                                          (auVar196 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) && -1 < auVar196[0x1f])
                                      goto LAB_0049a195;
                                      auVar133 = vandps_avx(auVar150,auVar134);
                                      local_5ee0._0_8_ = auVar119._0_8_;
                                      local_5ee0._8_8_ = auVar119._8_8_;
                                      _local_5f40 = auVar294;
                                      local_6020 = auVar132;
                                      _local_6060 = auVar265;
                                      local_5ee0._0_8_ = local_5ee0._0_8_;
                                      local_5ee0._8_8_ = local_5ee0._8_8_;
                                      local_5ee0._16_8_ = local_5ee0._0_8_;
                                      local_5ee0._24_8_ = local_5ee0._8_8_;
                                    }
                                  }
                                  local_5f60 = auVar178;
                                  local_60a0 = local_6020;
                                  auVar134 = _local_5f40;
                                  local_5f80 = _local_6060;
                                  if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar133 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar133 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar133 >> 0x7f,0) != '\0') ||
                                        (auVar133 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB321(auVar133 >> 0xbf,0) != '\0'
                                       ) || (auVar133 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) || auVar133[0x1f] < '\0') {
                                    auVar149._0_4_ =
                                         (float)(int)(*(ushort *)(lVar100 + 8 + lVar102) - 1);
                                    auVar279 = auVar161._4_12_;
                                    auVar149._4_12_ = auVar279;
                                    auVar119 = vrcpss_avx(auVar149,auVar149);
                                    auVar192._0_4_ =
                                         (float)(int)(*(ushort *)(lVar100 + 10 + lVar102) - 1);
                                    auVar192._4_12_ = auVar279;
                                    auVar170._0_4_ = (float)(int)(((uint)uVar101 & 1) + uVar93);
                                    auVar170._4_12_ = auVar279;
                                    auVar111 = vshufps_avx(auVar170,auVar170,0);
                                    fVar163 = auVar178._0_4_;
                                    fVar164 = auVar178._4_4_;
                                    fVar165 = auVar178._8_4_;
                                    fVar166 = auVar178._12_4_;
                                    fVar167 = auVar178._16_4_;
                                    fVar262 = auVar178._20_4_;
                                    fVar212 = auVar178._24_4_;
                                    auVar119 = ZEXT416((uint)(auVar119._0_4_ *
                                                             (2.0 - auVar119._0_4_ * auVar149._0_4_)
                                                             ));
                                    auVar119 = vshufps_avx(auVar119,auVar119,0);
                                    auVar58._4_4_ =
                                         (local_6020._4_4_ + fVar164 * auVar111._4_4_) *
                                         auVar119._4_4_;
                                    auVar58._0_4_ =
                                         (local_6020._0_4_ + fVar163 * auVar111._0_4_) *
                                         auVar119._0_4_;
                                    auVar58._8_4_ =
                                         (local_6020._8_4_ + fVar165 * auVar111._8_4_) *
                                         auVar119._8_4_;
                                    auVar58._12_4_ =
                                         (local_6020._12_4_ + fVar166 * auVar111._12_4_) *
                                         auVar119._12_4_;
                                    auVar58._16_4_ =
                                         (local_6020._16_4_ + fVar167 * auVar111._0_4_) *
                                         auVar119._0_4_;
                                    auVar58._20_4_ =
                                         (local_6020._20_4_ + fVar262 * auVar111._4_4_) *
                                         auVar119._4_4_;
                                    auVar58._24_4_ =
                                         (local_6020._24_4_ + fVar212 * auVar111._8_4_) *
                                         auVar119._8_4_;
                                    auVar58._28_4_ = auVar119._12_4_;
                                    auVar119 = vrcpss_avx(auVar192,auVar192);
                                    local_60a0 = vblendvps_avx(local_6020,auVar58,auVar133);
                                    auVar193._0_4_ =
                                         (float)(int)(((uint)(uVar101 >> 1) & 0x7fffffff) + uVar95);
                                    auVar193._4_12_ = auVar279;
                                    auVar111 = vshufps_avx(auVar193,auVar193,0);
                                    auVar119 = ZEXT416((uint)(auVar119._0_4_ *
                                                             (2.0 - auVar119._0_4_ * auVar192._0_4_)
                                                             ));
                                    auVar119 = vshufps_avx(auVar119,auVar119,0);
                                    auVar59._4_4_ =
                                         (local_6060._4_4_ + fVar164 * auVar111._4_4_) *
                                         auVar119._4_4_;
                                    auVar59._0_4_ =
                                         (local_6060._0_4_ + fVar163 * auVar111._0_4_) *
                                         auVar119._0_4_;
                                    auVar59._8_4_ =
                                         (local_6060._8_4_ + fVar165 * auVar111._8_4_) *
                                         auVar119._8_4_;
                                    auVar59._12_4_ =
                                         (local_6060._12_4_ + fVar166 * auVar111._12_4_) *
                                         auVar119._12_4_;
                                    auVar59._16_4_ =
                                         (local_6060._16_4_ + fVar167 * auVar111._0_4_) *
                                         auVar119._0_4_;
                                    auVar59._20_4_ =
                                         (local_6060._20_4_ + fVar262 * auVar111._4_4_) *
                                         auVar119._4_4_;
                                    auVar59._24_4_ =
                                         (local_6060._24_4_ + fVar212 * auVar111._8_4_) *
                                         auVar119._8_4_;
                                    auVar59._28_4_ = auVar119._12_4_;
                                    local_5f80 = vblendvps_avx(_local_6060,auVar59,auVar133);
                                    uVar238 = *(uint *)((long)&local_5dc0 + uVar101 * 4);
                                    pGVar7 = (context->scene->geometries).items[uVar238].ptr;
                                    uVar92 = pGVar7->mask;
                                    auVar156._4_4_ = uVar92;
                                    auVar156._0_4_ = uVar92;
                                    auVar156._8_4_ = uVar92;
                                    auVar156._12_4_ = uVar92;
                                    auVar156._16_4_ = uVar92;
                                    auVar156._20_4_ = uVar92;
                                    auVar156._24_4_ = uVar92;
                                    auVar156._28_4_ = uVar92;
                                    auVar134 = vandps_avx(auVar156,*(undefined1 (*) [32])
                                                                    (ray + 0x120));
                                    auVar119 = vpcmpeqd_avx(auVar134._16_16_,ZEXT416(0) << 0x20);
                                    auVar111 = vpcmpeqd_avx(auVar134._0_16_,ZEXT416(0) << 0x20);
                                    auVar176._16_16_ = auVar119;
                                    auVar176._0_16_ = auVar133._0_16_;
                                    uVar92 = auVar119._12_4_;
                                    auVar185 = ZEXT436(uVar92);
                                    auVar150 = vblendps_avx(ZEXT1632(auVar111),auVar176,0xf0);
                                    auVar196 = auVar133 & ~auVar150;
                                    auVar134 = _local_5f40;
                                    if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar196 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar196 >> 0x5f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar196 >> 0x7f,0) != '\0') ||
                                          (auVar196 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar196 >> 0xbf,0) != '\0') ||
                                        (auVar196 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || auVar196[0x1f] < '\0') {
                                      local_6040._8_8_ = 0;
                                      local_6040._0_8_ = uVar101;
                                      auVar136 = vandnps_avx(auVar150,auVar133);
                                      local_6020 = auVar270;
                                      _local_6060 = _local_5f40;
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (auVar185 = ZEXT436(uVar92),
                                         auVar298 = ZEXT436((uint)fVar41),
                                         pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar150 = vrcpps_avx(auVar178);
                                        fVar141 = auVar150._0_4_;
                                        fVar162 = auVar150._4_4_;
                                        auVar74._4_4_ = fVar164 * fVar162;
                                        auVar74._0_4_ = fVar163 * fVar141;
                                        fVar163 = auVar150._8_4_;
                                        auVar74._8_4_ = fVar165 * fVar163;
                                        fVar164 = auVar150._12_4_;
                                        auVar74._12_4_ = fVar166 * fVar164;
                                        fVar165 = auVar150._16_4_;
                                        auVar74._16_4_ = fVar167 * fVar165;
                                        fVar166 = auVar150._20_4_;
                                        auVar74._20_4_ = fVar262 * fVar166;
                                        fVar167 = auVar150._24_4_;
                                        auVar74._24_4_ = fVar212 * fVar167;
                                        auVar74._28_4_ = uVar92;
                                        auVar201._8_4_ = 0x3f800000;
                                        auVar201._0_8_ = &DAT_3f8000003f800000;
                                        auVar201._12_4_ = 0x3f800000;
                                        auVar201._16_4_ = 0x3f800000;
                                        auVar201._20_4_ = 0x3f800000;
                                        auVar201._24_4_ = 0x3f800000;
                                        auVar201._28_4_ = 0x3f800000;
                                        auVar196 = vsubps_avx(auVar201,auVar74);
                                        fVar141 = fVar141 + fVar141 * auVar196._0_4_;
                                        fVar162 = fVar162 + fVar162 * auVar196._4_4_;
                                        fVar163 = fVar163 + fVar163 * auVar196._8_4_;
                                        fVar164 = fVar164 + fVar164 * auVar196._12_4_;
                                        fVar165 = fVar165 + fVar165 * auVar196._16_4_;
                                        fVar166 = fVar166 + fVar166 * auVar196._20_4_;
                                        fVar167 = fVar167 + fVar167 * auVar196._24_4_;
                                        local_5b00._4_4_ = local_60a0._4_4_ * fVar162;
                                        local_5b00._0_4_ = local_60a0._0_4_ * fVar141;
                                        local_5b00._8_4_ = local_60a0._8_4_ * fVar163;
                                        local_5b00._12_4_ = local_60a0._12_4_ * fVar164;
                                        local_5b00._16_4_ = local_60a0._16_4_ * fVar165;
                                        local_5b00._20_4_ = local_60a0._20_4_ * fVar166;
                                        local_5b00._24_4_ = local_60a0._24_4_ * fVar167;
                                        local_5b00._28_4_ = auVar196._28_4_;
                                        pRVar10 = context->user;
                                        local_5a90 = vpshufd_avx(ZEXT416(uVar238),0);
                                        local_5ab0 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_5de0
                                                                                  + uVar101 * 4)),0)
                                        ;
                                        _local_5b60 = _local_5f40;
                                        local_5b40 = local_5ee0._0_8_;
                                        uStack_5b38 = local_5ee0._8_8_;
                                        uStack_5b30 = local_5ee0._16_8_;
                                        uStack_5b28 = local_5ee0._24_8_;
                                        local_5b20 = auVar270;
                                        local_5ae0 = local_5f80._0_4_ * fVar141;
                                        fStack_5adc = local_5f80._4_4_ * fVar162;
                                        fStack_5ad8 = local_5f80._8_4_ * fVar163;
                                        fStack_5ad4 = local_5f80._12_4_ * fVar164;
                                        fStack_5ad0 = local_5f80._16_4_ * fVar165;
                                        fStack_5acc = local_5f80._20_4_ * fVar166;
                                        fStack_5ac8 = local_5f80._24_4_ * fVar167;
                                        uStack_5ac4 = 0x3f800000;
                                        local_5ac0 = local_5ab0;
                                        local_5aa0 = local_5a90;
                                        auVar134 = vcmpps_avx(local_5b00,local_5b00,0xf);
                                        local_5f18[1] = auVar134;
                                        *local_5f18 = auVar134;
                                        local_5a80 = pRVar10->instID[0];
                                        auVar75._4_4_ = fVar162 * (float)local_6000._4_4_;
                                        auVar75._0_4_ = fVar141 * (float)local_6000._0_4_;
                                        auVar75._8_4_ = fVar163 * fStack_5ff8;
                                        auVar75._12_4_ = fVar164 * fStack_5ff4;
                                        auVar75._16_4_ = fVar165 * fStack_5ff0;
                                        auVar75._20_4_ = fVar166 * fStack_5fec;
                                        auVar75._24_4_ = fVar167 * fStack_5fe8;
                                        auVar75._28_4_ = auVar150._28_4_ + auVar196._28_4_;
                                        uStack_5a7c = local_5a80;
                                        uStack_5a78 = local_5a80;
                                        uStack_5a74 = local_5a80;
                                        uStack_5a70 = local_5a80;
                                        uStack_5a6c = local_5a80;
                                        uStack_5a68 = local_5a80;
                                        uStack_5a64 = local_5a80;
                                        uVar92 = pRVar10->instPrimID[0];
                                        local_5a60._4_4_ = uVar92;
                                        local_5a60._0_4_ = uVar92;
                                        local_5a60._8_4_ = uVar92;
                                        local_5a60._12_4_ = uVar92;
                                        local_5a60._16_4_ = uVar92;
                                        local_5a60._20_4_ = uVar92;
                                        local_5a60._24_4_ = uVar92;
                                        local_5a60._28_4_ = uVar92;
                                        auVar185 = ZEXT436(uVar92);
                                        auVar134 = *(undefined1 (*) [32])(ray + 0x100);
                                        auVar150 = vblendvps_avx(auVar134,auVar75,auVar136);
                                        *(undefined1 (*) [32])(ray + 0x100) = auVar150;
                                        _local_5fe0 = auVar136;
                                        local_5fc0 = (undefined1  [8])local_5fe0;
                                        uStack_5fb8 = pGVar7->userPtr;
                                        uStack_5fb0 = context->user;
                                        uStack_5fa8 = ray;
                                        local_5fa0 = (RTCHitN *)local_5b60;
                                        local_5f98 = 8;
                                        auVar298 = ZEXT436((uint)fVar41);
                                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          local_5e80._0_4_ = uVar93;
                                          local_6080 = ZEXT416(uVar95);
                                          auVar185 = (undefined1  [36])0x0;
                                          auVar298 = (undefined1  [36])0x0;
                                          _local_5f40 = auVar134;
                                          (*pGVar7->occlusionFilterN)
                                                    ((RTCFilterFunctionNArguments *)local_5fc0);
                                          lVar100 = local_6068;
                                          lVar102 = local_60c8;
                                          uVar95 = local_6080._0_4_;
                                          auVar134 = _local_5f40;
                                          uVar93 = local_5e80._0_4_;
                                        }
                                        auVar119 = vpcmpeqd_avx(ZEXT816(0) << 0x40,_local_5fe0);
                                        auVar111 = vpcmpeqd_avx(ZEXT816(0) << 0x40,_auStack_5fd0);
                                        auVar135._16_16_ = auVar111;
                                        auVar135._0_16_ = auVar119;
                                        auVar150 = vcmpps_avx(ZEXT1632(auVar111),ZEXT1632(auVar111),
                                                              0xf);
                                        auVar196 = auVar150 & ~auVar135;
                                        if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0 &&
                                                 (auVar196 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar196 >> 0x5f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               SUB321(auVar196 >> 0x7f,0) == '\0') &&
                                              (auVar196 & (undefined1  [32])0x100000000) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar196 >> 0xbf,0) == '\0') &&
                                            (auVar196 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar196[0x1f]) {
                                          auVar136._0_4_ = auVar119._0_4_ ^ auVar150._0_4_;
                                          auVar136._4_4_ = auVar119._4_4_ ^ auVar150._4_4_;
                                          auVar136._8_4_ = auVar119._8_4_ ^ auVar150._8_4_;
                                          auVar136._12_4_ = auVar119._12_4_ ^ auVar150._12_4_;
                                          auVar136._16_4_ = auVar111._0_4_ ^ auVar150._16_4_;
                                          auVar136._20_4_ = auVar111._4_4_ ^ auVar150._20_4_;
                                          auVar136._24_4_ = auVar111._8_4_ ^ auVar150._24_4_;
                                          auVar136._28_4_ = auVar111._12_4_ ^ auVar150._28_4_;
                                        }
                                        else {
                                          p_Var9 = context->args->filter;
                                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                            local_6080._0_4_ = uVar95;
                                            auVar298 = (undefined1  [36])0x0;
                                            _local_5f40 = auVar134;
                                            (*p_Var9)((RTCFilterFunctionNArguments *)local_5fc0);
                                            lVar100 = local_6068;
                                            lVar102 = local_60c8;
                                            uVar95 = local_6080._0_4_;
                                            auVar134 = _local_5f40;
                                          }
                                          auVar119 = vpcmpeqd_avx(ZEXT816(0) << 0x40,_local_5fe0);
                                          auVar111 = vpcmpeqd_avx(ZEXT816(0) << 0x40,_auStack_5fd0);
                                          auVar158._16_16_ = auVar111;
                                          auVar158._0_16_ = auVar119;
                                          auVar136._0_8_ = auVar119._0_8_ ^ 0xffffffffffffffff;
                                          auVar136._8_4_ = auVar119._8_4_ ^ 0xffffffff;
                                          auVar136._12_4_ = auVar119._12_4_ ^ 0xffffffff;
                                          auVar136._16_4_ = auVar111._0_4_ ^ 0xffffffff;
                                          auVar136._20_4_ = auVar111._4_4_ ^ 0xffffffff;
                                          auVar136._24_4_ = auVar111._8_4_ ^ 0xffffffff;
                                          auVar136._28_4_ = auVar111._12_4_ ^ 0xffffffff;
                                          auVar179._8_4_ = 0xff800000;
                                          auVar179._0_8_ = 0xff800000ff800000;
                                          auVar179._12_4_ = 0xff800000;
                                          auVar179._16_4_ = 0xff800000;
                                          auVar179._20_4_ = 0xff800000;
                                          auVar179._24_4_ = 0xff800000;
                                          auVar179._28_4_ = 0xff800000;
                                          auVar185 = ZEXT436(0xff800000);
                                          auVar150 = vblendvps_avx(auVar179,*(undefined1 (*) [32])
                                                                             (uStack_5fa8 + 0x100),
                                                                   auVar158);
                                          *(undefined1 (*) [32])(uStack_5fa8 + 0x100) = auVar150;
                                        }
                                        auVar134 = vblendvps_avx(auVar134,*(undefined1 (*) [32])
                                                                           local_6028,auVar136);
                                        *(undefined1 (*) [32])local_6028 = auVar134;
                                      }
                                      local_60c0 = vandnps_avx(auVar136,local_60c0);
                                      uVar101 = local_6040._0_8_;
                                      auVar134 = _local_6060;
                                      auVar270 = local_6020;
                                    }
                                  }
                                  local_6020 = auVar270;
                                  _local_6060 = auVar134;
                                  auVar88._4_4_ = fStack_589c;
                                  auVar88._0_4_ = local_58a0;
                                  auVar88._8_4_ = fStack_5898;
                                  auVar88._12_4_ = fStack_5894;
                                  auVar88._16_4_ = fStack_5890;
                                  auVar88._20_4_ = fStack_588c;
                                  auVar88._24_4_ = fStack_5888;
                                  auVar88._28_4_ = fStack_5884;
                                  auVar91._4_4_ = fStack_583c;
                                  auVar91._0_4_ = local_5840;
                                  auVar91._8_4_ = fStack_5838;
                                  auVar91._12_4_ = fStack_5834;
                                  auVar91._16_4_ = fStack_5830;
                                  auVar91._20_4_ = fStack_582c;
                                  auVar91._24_4_ = fStack_5828;
                                  auVar91._28_4_ = fStack_5824;
                                  auVar150 = vsubps_avx(auVar88,auVar91);
                                  auVar87._4_4_ = fStack_58bc;
                                  auVar87._0_4_ = local_58c0;
                                  auVar87._8_4_ = fStack_58b8;
                                  auVar87._12_4_ = fStack_58b4;
                                  auVar87._16_4_ = fStack_58b0;
                                  auVar87._20_4_ = fStack_58ac;
                                  auVar87._24_4_ = fStack_58a8;
                                  auVar87._28_4_ = fStack_58a4;
                                  auVar90._4_4_ = fStack_585c;
                                  auVar90._0_4_ = local_5860;
                                  auVar90._8_4_ = fStack_5858;
                                  auVar90._12_4_ = fStack_5854;
                                  auVar90._16_4_ = fStack_5850;
                                  auVar90._20_4_ = fStack_584c;
                                  auVar90._24_4_ = fStack_5848;
                                  auVar90._28_4_ = fStack_5844;
                                  auVar196 = vsubps_avx(auVar87,auVar90);
                                  auVar86._4_4_ = fStack_58dc;
                                  auVar86._0_4_ = local_58e0;
                                  auVar86._8_4_ = fStack_58d8;
                                  auVar86._12_4_ = fStack_58d4;
                                  auVar86._16_4_ = fStack_58d0;
                                  auVar86._20_4_ = fStack_58cc;
                                  auVar86._24_4_ = fStack_58c8;
                                  auVar86._28_4_ = fStack_58c4;
                                  auVar89._4_4_ = fStack_587c;
                                  auVar89._0_4_ = local_5880;
                                  auVar89._8_4_ = fStack_5878;
                                  auVar89._12_4_ = fStack_5874;
                                  auVar89._16_4_ = fStack_5870;
                                  auVar89._20_4_ = fStack_586c;
                                  auVar89._24_4_ = fStack_5868;
                                  auVar89._28_4_ = fStack_5864;
                                  auVar134 = vsubps_avx(auVar86,auVar89);
                                  auVar38 = vsubps_avx(_local_5d60,auVar88);
                                  auVar39 = vsubps_avx(_local_5d80,auVar87);
                                  auVar40 = vsubps_avx(_local_5da0,auVar86);
                                  fVar163 = auVar196._0_4_;
                                  fVar269 = auVar40._0_4_;
                                  fVar212 = auVar196._4_4_;
                                  fVar272 = auVar40._4_4_;
                                  auVar60._4_4_ = fVar272 * fVar212;
                                  auVar60._0_4_ = fVar269 * fVar163;
                                  fVar215 = auVar196._8_4_;
                                  fVar274 = auVar40._8_4_;
                                  auVar60._8_4_ = fVar274 * fVar215;
                                  fVar219 = auVar196._12_4_;
                                  fVar275 = auVar40._12_4_;
                                  auVar60._12_4_ = fVar275 * fVar219;
                                  fVar18 = auVar196._16_4_;
                                  fVar276 = auVar40._16_4_;
                                  auVar60._16_4_ = fVar276 * fVar18;
                                  fVar25 = auVar196._20_4_;
                                  fVar277 = auVar40._20_4_;
                                  auVar60._20_4_ = fVar277 * fVar25;
                                  fVar33 = auVar196._24_4_;
                                  uVar106 = local_5da0._28_4_;
                                  fVar278 = auVar40._24_4_;
                                  auVar60._24_4_ = fVar278 * fVar33;
                                  auVar60._28_4_ = uVar106;
                                  fVar164 = auVar134._0_4_;
                                  fVar251 = auVar39._0_4_;
                                  auVar184._0_4_ = fVar251 * fVar164;
                                  fVar141 = auVar134._4_4_;
                                  fVar254 = auVar39._4_4_;
                                  auVar184._4_4_ = fVar254 * fVar141;
                                  fVar217 = auVar134._8_4_;
                                  fVar255 = auVar39._8_4_;
                                  auVar184._8_4_ = fVar255 * fVar217;
                                  fVar221 = auVar134._12_4_;
                                  fVar256 = auVar39._12_4_;
                                  auVar184._12_4_ = fVar256 * fVar221;
                                  fVar19 = auVar134._16_4_;
                                  fVar257 = auVar39._16_4_;
                                  auVar184._16_4_ = fVar257 * fVar19;
                                  fVar26 = auVar134._20_4_;
                                  fVar258 = auVar39._20_4_;
                                  auVar184._20_4_ = fVar258 * fVar26;
                                  fVar34 = auVar134._24_4_;
                                  fVar259 = auVar39._24_4_;
                                  auVar184._24_4_ = fVar259 * fVar34;
                                  auVar184._28_36_ = auVar185;
                                  auVar120 = vsubps_avx(auVar184._0_32_,auVar60);
                                  _local_5da0 = auVar134;
                                  fVar237 = auVar38._0_4_;
                                  fVar239 = auVar38._4_4_;
                                  auVar61._4_4_ = fVar239 * fVar141;
                                  auVar61._0_4_ = fVar237 * fVar164;
                                  fVar241 = auVar38._8_4_;
                                  auVar61._8_4_ = fVar241 * fVar217;
                                  fVar243 = auVar38._12_4_;
                                  auVar61._12_4_ = fVar243 * fVar221;
                                  fVar245 = auVar38._16_4_;
                                  auVar61._16_4_ = fVar245 * fVar19;
                                  fVar247 = auVar38._20_4_;
                                  auVar61._20_4_ = fVar247 * fVar26;
                                  fVar249 = auVar38._24_4_;
                                  auVar61._24_4_ = fVar249 * fVar34;
                                  auVar61._28_4_ = uVar106;
                                  fVar165 = auVar150._0_4_;
                                  fVar162 = auVar150._4_4_;
                                  auVar62._4_4_ = fVar272 * fVar162;
                                  auVar62._0_4_ = fVar269 * fVar165;
                                  fVar24 = auVar150._8_4_;
                                  auVar62._8_4_ = fVar274 * fVar24;
                                  fVar13 = auVar150._12_4_;
                                  auVar62._12_4_ = fVar275 * fVar13;
                                  fVar20 = auVar150._16_4_;
                                  auVar62._16_4_ = fVar276 * fVar20;
                                  fVar27 = auVar150._20_4_;
                                  auVar62._20_4_ = fVar277 * fVar27;
                                  fVar35 = auVar150._24_4_;
                                  auVar62._24_4_ = fVar278 * fVar35;
                                  auVar62._28_4_ = auVar185._0_4_;
                                  auVar197 = vsubps_avx(auVar62,auVar61);
                                  auVar210 = ZEXT3264(auVar197);
                                  _local_5d60 = auVar150;
                                  auVar63._4_4_ = fVar254 * fVar162;
                                  auVar63._0_4_ = fVar251 * fVar165;
                                  auVar63._8_4_ = fVar255 * fVar24;
                                  auVar63._12_4_ = fVar256 * fVar13;
                                  auVar63._16_4_ = fVar257 * fVar20;
                                  auVar63._20_4_ = fVar258 * fVar27;
                                  auVar63._24_4_ = fVar259 * fVar35;
                                  auVar63._28_4_ = uVar106;
                                  _local_5d80 = auVar196;
                                  auVar64._4_4_ = fVar212 * fVar239;
                                  auVar64._0_4_ = fVar163 * fVar237;
                                  auVar64._8_4_ = fVar215 * fVar241;
                                  auVar64._12_4_ = fVar219 * fVar243;
                                  auVar64._16_4_ = fVar18 * fVar245;
                                  auVar64._20_4_ = fVar25 * fVar247;
                                  auVar64._24_4_ = fVar33 * fVar249;
                                  auVar64._28_4_ = auVar185._0_4_;
                                  local_5ec0 = vsubps_avx(auVar64,auVar63);
                                  auVar198 = vsubps_avx(auVar88,*(undefined1 (*) [32])ray);
                                  auVar119 = auVar198._0_16_;
                                  auVar134 = vsubps_avx(auVar87,*(undefined1 (*) [32])(ray + 0x20));
                                  auVar207 = vsubps_avx(auVar86,*(undefined1 (*) [32])(ray + 0x40));
                                  fVar266 = *(float *)(ray + 0xa0);
                                  fVar267 = *(float *)(ray + 0xa4);
                                  fVar268 = *(float *)(ray + 0xa8);
                                  fVar271 = *(float *)(ray + 0xac);
                                  fVar273 = *(float *)(ray + 0xb0);
                                  fVar280 = *(float *)(ray + 0xb4);
                                  fVar282 = *(float *)(ray + 0xb8);
                                  fVar284 = *(float *)(ray + 0xc0);
                                  fVar286 = *(float *)(ray + 0xc4);
                                  fVar288 = *(float *)(ray + 200);
                                  fVar290 = *(float *)(ray + 0xcc);
                                  fVar292 = *(float *)(ray + 0xd0);
                                  fVar296 = *(float *)(ray + 0xd4);
                                  fVar297 = *(float *)(ray + 0xd8);
                                  fVar203 = auVar207._0_4_;
                                  fVar211 = auVar207._4_4_;
                                  auVar65._4_4_ = fVar211 * fVar267;
                                  auVar65._0_4_ = fVar203 * fVar266;
                                  fVar213 = auVar207._8_4_;
                                  auVar65._8_4_ = fVar213 * fVar268;
                                  fVar214 = auVar207._12_4_;
                                  auVar65._12_4_ = fVar214 * fVar271;
                                  fVar216 = auVar207._16_4_;
                                  auVar65._16_4_ = fVar216 * fVar273;
                                  fVar218 = auVar207._20_4_;
                                  auVar65._20_4_ = fVar218 * fVar280;
                                  fVar220 = auVar207._24_4_;
                                  auVar65._24_4_ = fVar220 * fVar282;
                                  auVar65._28_4_ = fStack_58c4;
                                  fVar166 = auVar134._0_4_;
                                  fVar11 = auVar134._4_4_;
                                  auVar66._4_4_ = fVar286 * fVar11;
                                  auVar66._0_4_ = fVar284 * fVar166;
                                  fVar31 = auVar134._8_4_;
                                  auVar66._8_4_ = fVar288 * fVar31;
                                  fVar14 = auVar134._12_4_;
                                  auVar66._12_4_ = fVar290 * fVar14;
                                  fVar21 = auVar134._16_4_;
                                  auVar66._16_4_ = fVar292 * fVar21;
                                  fVar28 = auVar134._20_4_;
                                  auVar66._20_4_ = fVar296 * fVar28;
                                  fVar36 = auVar134._24_4_;
                                  auVar66._24_4_ = fVar297 * fVar36;
                                  auVar66._28_4_ = auVar150._28_4_;
                                  auVar226 = vsubps_avx(auVar66,auVar65);
                                  auVar134 = *(undefined1 (*) [32])(ray + 0x80);
                                  auVar279 = auVar134._4_12_;
                                  fVar167 = auVar198._0_4_;
                                  fVar12 = auVar198._4_4_;
                                  auVar67._4_4_ = fVar286 * fVar12;
                                  auVar67._0_4_ = fVar284 * fVar167;
                                  fVar32 = auVar198._8_4_;
                                  auVar67._8_4_ = fVar288 * fVar32;
                                  fVar15 = auVar198._12_4_;
                                  auVar67._12_4_ = fVar290 * fVar15;
                                  fVar22 = auVar198._16_4_;
                                  auVar67._16_4_ = fVar292 * fVar22;
                                  fVar29 = auVar198._20_4_;
                                  auVar67._20_4_ = fVar296 * fVar29;
                                  fVar37 = auVar198._24_4_;
                                  auVar67._24_4_ = fVar297 * fVar37;
                                  auVar67._28_4_ = auVar150._28_4_;
                                  fVar281 = auVar134._0_4_;
                                  fVar283 = auVar134._4_4_;
                                  auVar68._4_4_ = fVar283 * fVar211;
                                  auVar68._0_4_ = fVar281 * fVar203;
                                  fVar285 = auVar134._8_4_;
                                  auVar68._8_4_ = fVar285 * fVar213;
                                  fVar287 = auVar134._12_4_;
                                  auVar68._12_4_ = fVar287 * fVar214;
                                  fVar289 = auVar134._16_4_;
                                  auVar68._16_4_ = fVar289 * fVar216;
                                  fVar291 = auVar134._20_4_;
                                  auVar68._20_4_ = fVar291 * fVar218;
                                  fVar293 = auVar134._24_4_;
                                  auVar68._24_4_ = fVar293 * fVar220;
                                  auVar68._28_4_ = auVar196._28_4_;
                                  auVar150 = vsubps_avx(auVar68,auVar67);
                                  auVar69._4_4_ = fVar283 * fVar11;
                                  auVar69._0_4_ = fVar281 * fVar166;
                                  auVar69._8_4_ = fVar285 * fVar31;
                                  auVar69._12_4_ = fVar287 * fVar14;
                                  auVar69._16_4_ = fVar289 * fVar21;
                                  auVar69._20_4_ = fVar291 * fVar28;
                                  auVar69._24_4_ = fVar293 * fVar36;
                                  auVar69._28_4_ = auVar196._28_4_;
                                  auVar161._0_4_ = fVar167 * fVar266;
                                  auVar161._4_4_ = fVar12 * fVar267;
                                  auVar161._8_4_ = fVar32 * fVar268;
                                  auVar161._12_4_ = fVar15 * fVar271;
                                  auVar161._16_4_ = fVar22 * fVar273;
                                  auVar161._20_4_ = fVar29 * fVar280;
                                  auVar161._24_4_ = fVar37 * fVar282;
                                  auVar161._28_36_ = auVar298;
                                  auVar196 = vsubps_avx(auVar161._0_32_,auVar69);
                                  fVar262 = auVar120._0_4_;
                                  fVar17 = auVar120._4_4_;
                                  fVar41 = auVar120._8_4_;
                                  fVar16 = auVar120._12_4_;
                                  fVar23 = auVar120._16_4_;
                                  fVar30 = auVar120._20_4_;
                                  fVar263 = auVar120._24_4_;
                                  auVar224._0_4_ =
                                       fVar281 * fVar262 +
                                       fVar284 * local_5ec0._0_4_ + auVar197._0_4_ * fVar266;
                                  auVar224._4_4_ =
                                       fVar283 * fVar17 +
                                       fVar286 * local_5ec0._4_4_ + auVar197._4_4_ * fVar267;
                                  auVar224._8_4_ =
                                       fVar285 * fVar41 +
                                       fVar288 * local_5ec0._8_4_ + auVar197._8_4_ * fVar268;
                                  auVar224._12_4_ =
                                       fVar287 * fVar16 +
                                       fVar290 * local_5ec0._12_4_ + auVar197._12_4_ * fVar271;
                                  auVar229._16_4_ =
                                       fVar289 * fVar23 +
                                       fVar292 * local_5ec0._16_4_ + auVar197._16_4_ * fVar273;
                                  auVar229._0_16_ = auVar224;
                                  auVar229._20_4_ =
                                       fVar291 * fVar30 +
                                       fVar296 * local_5ec0._20_4_ + auVar197._20_4_ * fVar280;
                                  auVar229._24_4_ =
                                       fVar293 * fVar263 +
                                       fVar297 * local_5ec0._24_4_ + auVar197._24_4_ * fVar282;
                                  auVar229._28_4_ =
                                       *(float *)(ray + 0xdc) +
                                       *(float *)(ray + 0xdc) + *(float *)(ray + 0xbc);
                                  auVar253._8_4_ = 0x80000000;
                                  auVar253._0_8_ = 0x8000000080000000;
                                  auVar253._12_4_ = 0x80000000;
                                  auVar253._16_4_ = 0x80000000;
                                  auVar253._20_4_ = 0x80000000;
                                  auVar253._24_4_ = 0x80000000;
                                  auVar253._28_4_ = 0x80000000;
                                  auVar134 = vandps_avx(auVar253,auVar229);
                                  uVar92 = auVar134._0_4_;
                                  auVar295._0_4_ =
                                       uVar92 ^ (uint)(fVar251 * auVar150._0_4_ +
                                                       fVar269 * auVar196._0_4_ +
                                                      auVar226._0_4_ * fVar237);
                                  uVar238 = auVar134._4_4_;
                                  auVar295._4_4_ =
                                       uVar238 ^ (uint)(fVar254 * auVar150._4_4_ +
                                                        fVar272 * auVar196._4_4_ +
                                                       auVar226._4_4_ * fVar239);
                                  uVar240 = auVar134._8_4_;
                                  auVar295._8_4_ =
                                       uVar240 ^ (uint)(fVar255 * auVar150._8_4_ +
                                                        fVar274 * auVar196._8_4_ +
                                                       auVar226._8_4_ * fVar241);
                                  uVar242 = auVar134._12_4_;
                                  auVar295._12_4_ =
                                       uVar242 ^ (uint)(fVar256 * auVar150._12_4_ +
                                                        fVar275 * auVar196._12_4_ +
                                                       auVar226._12_4_ * fVar243);
                                  uVar244 = auVar134._16_4_;
                                  auVar295._16_4_ =
                                       uVar244 ^ (uint)(fVar257 * auVar150._16_4_ +
                                                        fVar276 * auVar196._16_4_ +
                                                       auVar226._16_4_ * fVar245);
                                  uVar246 = auVar134._20_4_;
                                  auVar295._20_4_ =
                                       uVar246 ^ (uint)(fVar258 * auVar150._20_4_ +
                                                        fVar277 * auVar196._20_4_ +
                                                       auVar226._20_4_ * fVar247);
                                  uVar248 = auVar134._24_4_;
                                  auVar295._24_4_ =
                                       uVar248 ^ (uint)(fVar259 * auVar150._24_4_ +
                                                        fVar278 * auVar196._24_4_ +
                                                       auVar226._24_4_ * fVar249);
                                  uVar250 = auVar134._28_4_;
                                  auVar295._28_4_ =
                                       uVar250 ^ (uint)(auVar39._28_4_ + auVar40._28_4_ +
                                                       auVar38._28_4_);
                                  auVar134 = vcmpps_avx(auVar295,_DAT_02020f00,5);
                                  auVar161 = ZEXT3264(local_60c0);
                                  auVar38 = local_60c0 & auVar134;
                                  fStack_5f24 = auVar120._28_4_;
                                  local_5ea0._24_8_ = auVar197._24_8_;
                                  local_5ea0._0_8_ = local_5ee0._0_8_;
                                  local_5ea0._8_8_ = local_5ee0._8_8_;
                                  local_5ea0._16_8_ = local_5ee0._16_8_;
                                  if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar38 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar38 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar38 >> 0x7f,0) == '\0') &&
                                        (auVar38 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar38 >> 0xbf,0) == '\0')
                                      && (auVar38 & (undefined1  [32])0x100000000) ==
                                         (undefined1  [32])0x0) && -1 < auVar38[0x1f]) {
LAB_00499753:
                                    auVar140 = ZEXT3264(CONCAT824(uStack_5ee8,
                                                                  CONCAT816(uStack_5ef0,
                                                                            CONCAT88(uStack_5ef8,
                                                                                     local_5f00))));
                                    auVar184 = ZEXT3264(local_60a0);
                                    auVar236 = local_5f80;
                                    local_5ea0._24_8_ = local_5ee0._24_8_;
                                    local_5ec0 = local_6020;
                                    auVar196 = local_5f60;
                                    auVar200 = _local_6000;
                                  }
                                  else {
                                    auVar279 = auVar207._4_12_;
                                    auVar134 = vandps_avx(local_60c0,auVar134);
                                    fVar163 = auVar150._0_4_ * fVar163 + auVar196._0_4_ * fVar164;
                                    fVar164 = auVar150._4_4_ * fVar212 + auVar196._4_4_ * fVar141;
                                    fVar212 = auVar150._8_4_ * fVar215 + auVar196._8_4_ * fVar217;
                                    fVar141 = auVar150._12_4_ * fVar219 + auVar196._12_4_ * fVar221;
                                    fVar215 = auVar150._16_4_ * fVar18 + auVar196._16_4_ * fVar19;
                                    fVar217 = auVar150._20_4_ * fVar25 + auVar196._20_4_ * fVar26;
                                    fVar219 = auVar150._24_4_ * fVar33 + auVar196._24_4_ * fVar34;
                                    fVar221 = auVar197._28_4_ + auVar207._28_4_;
                                    auVar210 = ZEXT3264(CONCAT428(fVar221,CONCAT424(fVar219,
                                                  CONCAT420(fVar217,CONCAT416(fVar215,CONCAT412(
                                                  fVar141,CONCAT48(fVar212,CONCAT44(fVar164,fVar163)
                                                                  )))))));
                                    auVar236._0_4_ =
                                         uVar92 ^ (uint)(auVar226._0_4_ * fVar165 + fVar163);
                                    auVar236._4_4_ =
                                         uVar238 ^ (uint)(auVar226._4_4_ * fVar162 + fVar164);
                                    auVar236._8_4_ =
                                         uVar240 ^ (uint)(auVar226._8_4_ * fVar24 + fVar212);
                                    auVar236._12_4_ =
                                         uVar242 ^ (uint)(auVar226._12_4_ * fVar13 + fVar141);
                                    auVar236._16_4_ =
                                         uVar244 ^ (uint)(auVar226._16_4_ * fVar20 + fVar215);
                                    auVar236._20_4_ =
                                         uVar246 ^ (uint)(auVar226._20_4_ * fVar27 + fVar217);
                                    auVar236._24_4_ =
                                         uVar248 ^ (uint)(auVar226._24_4_ * fVar35 + fVar219);
                                    auVar236._28_4_ = uVar250 ^ (uint)(fStack_5f24 + fVar221);
                                    auVar150 = vcmpps_avx(auVar236,_DAT_02020f00,5);
                                    auVar196 = auVar134 & auVar150;
                                    if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar196 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar196 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar196 >> 0x7f,0) == '\0') &&
                                          (auVar196 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar196 >> 0xbf,0) == '\0') &&
                                        (auVar196 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar196[0x1f])
                                    goto LAB_00499753;
                                    auVar209._8_4_ = 0x7fffffff;
                                    auVar209._0_8_ = 0x7fffffff7fffffff;
                                    auVar209._12_4_ = 0x7fffffff;
                                    auVar209._16_4_ = 0x7fffffff;
                                    auVar209._20_4_ = 0x7fffffff;
                                    auVar209._24_4_ = 0x7fffffff;
                                    auVar209._28_4_ = 0x7fffffff;
                                    auVar196 = vandps_avx(auVar229,auVar209);
                                    auVar134 = vandps_avx(auVar150,auVar134);
                                    auVar150 = vsubps_avx(auVar196,auVar295);
                                    auVar150 = vcmpps_avx(auVar150,auVar236,5);
                                    auVar210 = ZEXT3264(auVar150);
                                    auVar38 = auVar134 & auVar150;
                                    if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar38 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar38 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar38 >> 0x7f,0) == '\0') &&
                                          (auVar38 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar38 >> 0xbf,0) == '\0') &&
                                        (auVar38 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar38[0x1f])
                                    goto LAB_00499753;
                                    auVar134 = vandps_avx(auVar150,auVar134);
                                    fVar203 = fVar203 * local_5ec0._0_4_;
                                    fVar211 = fVar211 * local_5ec0._4_4_;
                                    fVar213 = fVar213 * local_5ec0._8_4_;
                                    fVar214 = fVar214 * local_5ec0._12_4_;
                                    fVar216 = fVar216 * local_5ec0._16_4_;
                                    fVar218 = fVar218 * local_5ec0._20_4_;
                                    fVar220 = fVar220 * local_5ec0._24_4_;
                                    auVar210 = ZEXT3264(CONCAT428(auVar150._28_4_,
                                                                  CONCAT424(fVar220,CONCAT420(
                                                  fVar218,CONCAT416(fVar216,CONCAT412(fVar214,
                                                  CONCAT48(fVar213,CONCAT44(fVar211,fVar203))))))));
                                    fVar164 = auVar198._28_4_ + auVar150._28_4_;
                                    fVar163 = auVar198._28_4_ + fVar164;
                                    auVar200._0_4_ =
                                         uVar92 ^ (uint)(fVar262 * fVar167 +
                                                        fVar166 * auVar197._0_4_ + fVar203);
                                    auVar200._4_4_ =
                                         uVar238 ^ (uint)(fVar17 * fVar12 +
                                                         fVar11 * auVar197._4_4_ + fVar211);
                                    auVar200._8_4_ =
                                         uVar240 ^ (uint)(fVar41 * fVar32 +
                                                         fVar31 * auVar197._8_4_ + fVar213);
                                    auVar200._12_4_ =
                                         uVar242 ^ (uint)(fVar16 * fVar15 +
                                                         fVar14 * auVar197._12_4_ + fVar214);
                                    auVar200._16_4_ =
                                         uVar244 ^ (uint)(fVar23 * fVar22 +
                                                         fVar21 * auVar197._16_4_ + fVar216);
                                    auVar200._20_4_ =
                                         uVar246 ^ (uint)(fVar30 * fVar29 +
                                                         fVar28 * auVar197._20_4_ + fVar218);
                                    auVar200._24_4_ =
                                         uVar248 ^ (uint)(fVar263 * fVar37 +
                                                         fVar36 * auVar197._24_4_ + fVar220);
                                    auVar200._28_4_ = uVar250 ^ (uint)fVar163;
                                    auVar72._4_4_ = auVar196._4_4_ * *(float *)(ray + 100);
                                    auVar72._0_4_ = auVar196._0_4_ * *(float *)(ray + 0x60);
                                    auVar72._8_4_ = auVar196._8_4_ * *(float *)(ray + 0x68);
                                    auVar72._12_4_ = auVar196._12_4_ * *(float *)(ray + 0x6c);
                                    auVar72._16_4_ = auVar196._16_4_ * *(float *)(ray + 0x70);
                                    auVar72._20_4_ = auVar196._20_4_ * *(float *)(ray + 0x74);
                                    auVar72._24_4_ = auVar196._24_4_ * *(float *)(ray + 0x78);
                                    auVar72._28_4_ = fVar163;
                                    auVar73._4_4_ = auVar196._4_4_ * *(float *)(ray + 0x104);
                                    auVar73._0_4_ = auVar196._0_4_ * *(float *)(ray + 0x100);
                                    auVar73._8_4_ = auVar196._8_4_ * *(float *)(ray + 0x108);
                                    auVar73._12_4_ = auVar196._12_4_ * *(float *)(ray + 0x10c);
                                    auVar73._16_4_ = auVar196._16_4_ * *(float *)(ray + 0x110);
                                    auVar73._20_4_ = auVar196._20_4_ * *(float *)(ray + 0x114);
                                    auVar73._24_4_ = auVar196._24_4_ * *(float *)(ray + 0x118);
                                    auVar73._28_4_ = fVar164;
                                    auVar150 = vcmpps_avx(auVar72,auVar200,1);
                                    auVar38 = vcmpps_avx(auVar200,auVar73,2);
                                    auVar119 = auVar38._0_16_;
                                    auVar150 = vandps_avx(auVar38,auVar150);
                                    auVar38 = auVar134 & auVar150;
                                    if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar38 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar38 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar38 >> 0x7f,0) == '\0') &&
                                          (auVar38 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar38 >> 0xbf,0) == '\0') &&
                                        (auVar38 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar38[0x1f]) {
LAB_0049a142:
                                      auVar140 = ZEXT3264(CONCAT824(uStack_5ee8,
                                                                    CONCAT816(uStack_5ef0,
                                                                              CONCAT88(uStack_5ef8,
                                                                                       local_5f00)))
                                                         );
                                      auVar184 = ZEXT3264(local_60a0);
                                      auVar236 = local_5f80;
                                      local_5ea0._24_8_ = local_5ee0._24_8_;
                                      local_5ec0 = local_6020;
                                      auVar196 = local_5f60;
                                      auVar200 = _local_6000;
                                    }
                                    else {
                                      auVar134 = vandps_avx(auVar150,auVar134);
                                      auVar150 = vcmpps_avx(auVar229,_DAT_02020f00,4);
                                      auVar38 = auVar134 & auVar150;
                                      if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar38 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar38 >> 0x5f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar38 >> 0x7f,0) == '\0') &&
                                            (auVar38 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar38 >> 0xbf,0) == '\0') &&
                                          (auVar38 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) && -1 < auVar38[0x1f])
                                      goto LAB_0049a142;
                                      auVar134 = vandps_avx(auVar150,auVar134);
                                      auVar140 = ZEXT3264(auVar134);
                                      local_5ea0._0_8_ = auVar197._0_8_;
                                      local_5ea0._8_8_ = auVar197._8_8_;
                                      local_5ea0._16_8_ = auVar197._16_8_;
                                      auVar184 = ZEXT3264(auVar295);
                                      local_6060._0_4_ = fVar262;
                                      local_6060._4_4_ = fVar17;
                                      fStack_6058 = fVar41;
                                      fStack_6054 = fVar16;
                                      fStack_6050 = fVar23;
                                      fStack_604c = fVar30;
                                      fStack_6048 = fVar263;
                                      fStack_6044 = fStack_5f24;
                                      local_5ea0._0_8_ = local_5ea0._0_8_;
                                      local_5ea0._8_8_ = local_5ea0._8_8_;
                                      local_5ea0._16_8_ = local_5ea0._16_8_;
                                      local_5ea0._24_8_ = local_5ea0._24_8_;
                                    }
                                  }
                                  auVar134 = auVar140._0_32_;
                                  local_5f40._4_4_ = local_6060._4_4_;
                                  local_5f40._0_4_ = local_6060._0_4_;
                                  fStack_5f38 = fStack_6058;
                                  fStack_5f34 = fStack_6054;
                                  fStack_5f30 = fStack_6050;
                                  fStack_5f2c = fStack_604c;
                                  fStack_5f28 = fStack_6048;
                                  fStack_5f24 = fStack_6044;
                                  local_5f80 = auVar196;
                                  local_5f60 = auVar200;
                                  if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar134 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar134 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar134 >> 0x7f,0) != '\0') ||
                                        (auVar140 & (undefined1  [64])0x100000000) !=
                                        (undefined1  [64])0x0) || SUB321(auVar134 >> 0xbf,0) != '\0'
                                       ) || (auVar140 & (undefined1  [64])0x100000000) !=
                                            (undefined1  [64])0x0) || auVar140[0x1f] < '\0') {
                                    auVar150 = vsubps_avx(auVar196,auVar184._0_32_);
                                    auVar38 = vsubps_avx(auVar196,auVar236);
                                    auVar194._0_4_ =
                                         (float)(int)(*(ushort *)(lVar100 + 8 + lVar102) - 1);
                                    auVar225._4_12_ = auVar224._4_12_;
                                    auVar194._4_12_ = auVar225._4_12_;
                                    auVar119 = vrcpss_avx(auVar194,auVar194);
                                    auVar225._0_4_ =
                                         (float)(int)(*(ushort *)(lVar100 + 10 + lVar102) - 1);
                                    auVar206._0_4_ = (float)(int)(((uint)uVar101 & 1) + uVar93);
                                    auVar206._4_12_ = auVar279;
                                    auVar111 = vshufps_avx(auVar206,auVar206,0);
                                    fVar163 = auVar196._0_4_;
                                    fVar164 = auVar196._4_4_;
                                    fVar165 = auVar196._8_4_;
                                    fVar166 = auVar196._12_4_;
                                    fVar167 = auVar196._16_4_;
                                    fVar262 = auVar196._20_4_;
                                    fVar212 = auVar196._24_4_;
                                    auVar119 = ZEXT416((uint)(auVar119._0_4_ *
                                                             (2.0 - auVar119._0_4_ * auVar194._0_4_)
                                                             ));
                                    auVar119 = vshufps_avx(auVar119,auVar119,0);
                                    auVar70._4_4_ =
                                         (auVar150._4_4_ + fVar164 * auVar111._4_4_) *
                                         auVar119._4_4_;
                                    auVar70._0_4_ =
                                         (auVar150._0_4_ + fVar163 * auVar111._0_4_) *
                                         auVar119._0_4_;
                                    auVar70._8_4_ =
                                         (auVar150._8_4_ + fVar165 * auVar111._8_4_) *
                                         auVar119._8_4_;
                                    auVar70._12_4_ =
                                         (auVar150._12_4_ + fVar166 * auVar111._12_4_) *
                                         auVar119._12_4_;
                                    auVar70._16_4_ =
                                         (auVar150._16_4_ + fVar167 * auVar111._0_4_) *
                                         auVar119._0_4_;
                                    auVar70._20_4_ =
                                         (auVar150._20_4_ + fVar262 * auVar111._4_4_) *
                                         auVar119._4_4_;
                                    auVar70._24_4_ =
                                         (auVar150._24_4_ + fVar212 * auVar111._8_4_) *
                                         auVar119._8_4_;
                                    auVar70._28_4_ = auVar119._12_4_;
                                    auVar119 = vrcpss_avx(auVar225,auVar225);
                                    auVar210 = ZEXT1664(auVar119);
                                    local_6020 = vblendvps_avx(auVar150,auVar70,auVar134);
                                    auVar184 = ZEXT3264(local_6020);
                                    auVar195._0_4_ =
                                         (float)(int)(((uint)(uVar101 >> 1) & 0x7fffffff) + uVar95);
                                    auVar195._4_12_ = auVar279;
                                    auVar111 = vshufps_avx(auVar195,auVar195,0);
                                    auVar119 = ZEXT416((uint)(auVar119._0_4_ *
                                                             (2.0 - auVar119._0_4_ * auVar225._0_4_)
                                                             ));
                                    auVar119 = vshufps_avx(auVar119,auVar119,0);
                                    auVar71._4_4_ =
                                         (auVar38._4_4_ + fVar164 * auVar111._4_4_) * auVar119._4_4_
                                    ;
                                    auVar71._0_4_ =
                                         (auVar38._0_4_ + fVar163 * auVar111._0_4_) * auVar119._0_4_
                                    ;
                                    auVar71._8_4_ =
                                         (auVar38._8_4_ + fVar165 * auVar111._8_4_) * auVar119._8_4_
                                    ;
                                    auVar71._12_4_ =
                                         (auVar38._12_4_ + fVar166 * auVar111._12_4_) *
                                         auVar119._12_4_;
                                    auVar71._16_4_ =
                                         (auVar38._16_4_ + fVar167 * auVar111._0_4_) *
                                         auVar119._0_4_;
                                    auVar71._20_4_ =
                                         (auVar38._20_4_ + fVar262 * auVar111._4_4_) *
                                         auVar119._4_4_;
                                    auVar71._24_4_ =
                                         (auVar38._24_4_ + fVar212 * auVar111._8_4_) *
                                         auVar119._8_4_;
                                    auVar71._28_4_ = auVar119._12_4_;
                                    auVar236 = vblendvps_avx(auVar38,auVar71,auVar134);
                                    uVar238 = *(uint *)((long)&local_5dc0 + uVar101 * 4);
                                    pGVar7 = (context->scene->geometries).items[uVar238].ptr;
                                    uVar92 = pGVar7->mask;
                                    auVar157._4_4_ = uVar92;
                                    auVar157._0_4_ = uVar92;
                                    auVar157._8_4_ = uVar92;
                                    auVar157._12_4_ = uVar92;
                                    auVar157._16_4_ = uVar92;
                                    auVar157._20_4_ = uVar92;
                                    auVar157._24_4_ = uVar92;
                                    auVar157._28_4_ = uVar92;
                                    auVar150 = vandps_avx(auVar157,*(undefined1 (*) [32])
                                                                    (ray + 0x120));
                                    auVar111 = vpcmpeqd_avx(auVar150._16_16_,ZEXT416(0) << 0x20);
                                    auVar142 = vpcmpeqd_avx(auVar150._0_16_,ZEXT416(0) << 0x20);
                                    auVar119 = auVar140._0_16_;
                                    auVar177._16_16_ = auVar111;
                                    auVar177._0_16_ = auVar119;
                                    auVar150 = vblendps_avx(ZEXT1632(auVar142),auVar177,0xf0);
                                    auVar38 = auVar134 & ~auVar150;
                                    if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar38 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar38 >> 0x5f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar38 >> 0x7f,0) != '\0') ||
                                          (auVar38 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar38 >> 0xbf,0) != '\0') ||
                                        (auVar38 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || auVar38[0x1f] < '\0') {
                                      local_6040._0_8_ = uVar101;
                                      auVar138 = vandnps_avx(auVar150,auVar134);
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar150 = vrcpps_avx(auVar196);
                                        fVar141 = auVar150._0_4_;
                                        fVar162 = auVar150._4_4_;
                                        auVar76._4_4_ = fVar164 * fVar162;
                                        auVar76._0_4_ = fVar163 * fVar141;
                                        fVar163 = auVar150._8_4_;
                                        auVar76._8_4_ = fVar165 * fVar163;
                                        fVar164 = auVar150._12_4_;
                                        auVar76._12_4_ = fVar166 * fVar164;
                                        fVar165 = auVar150._16_4_;
                                        auVar76._16_4_ = fVar167 * fVar165;
                                        fVar166 = auVar150._20_4_;
                                        auVar76._20_4_ = fVar262 * fVar166;
                                        fVar167 = auVar150._24_4_;
                                        auVar76._24_4_ = fVar212 * fVar167;
                                        auVar76._28_4_ = auVar111._12_4_;
                                        auVar202._8_4_ = 0x3f800000;
                                        auVar202._0_8_ = &DAT_3f8000003f800000;
                                        auVar202._12_4_ = 0x3f800000;
                                        auVar202._16_4_ = 0x3f800000;
                                        auVar202._20_4_ = 0x3f800000;
                                        auVar202._24_4_ = 0x3f800000;
                                        auVar202._28_4_ = 0x3f800000;
                                        auVar196 = vsubps_avx(auVar202,auVar76);
                                        fVar141 = fVar141 + fVar141 * auVar196._0_4_;
                                        fVar162 = fVar162 + fVar162 * auVar196._4_4_;
                                        fVar163 = fVar163 + fVar163 * auVar196._8_4_;
                                        fVar164 = fVar164 + fVar164 * auVar196._12_4_;
                                        fVar165 = fVar165 + fVar165 * auVar196._16_4_;
                                        fVar166 = fVar166 + fVar166 * auVar196._20_4_;
                                        fVar167 = fVar167 + fVar167 * auVar196._24_4_;
                                        local_5b00._4_4_ = local_6020._4_4_ * fVar162;
                                        local_5b00._0_4_ = local_6020._0_4_ * fVar141;
                                        local_5b00._8_4_ = local_6020._8_4_ * fVar163;
                                        local_5b00._12_4_ = local_6020._12_4_ * fVar164;
                                        local_5b00._16_4_ = local_6020._16_4_ * fVar165;
                                        local_5b00._20_4_ = local_6020._20_4_ * fVar166;
                                        local_5b00._24_4_ = local_6020._24_4_ * fVar167;
                                        local_5b00._28_4_ = auVar196._28_4_;
                                        pRVar10 = context->user;
                                        local_5a90 = vpshufd_avx(ZEXT416(uVar238),0);
                                        auVar210 = ZEXT1664(local_5a90);
                                        local_5ab0 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_5de0
                                                                                  + uVar101 * 4)),0)
                                        ;
                                        local_5b60._4_4_ = local_6060._4_4_;
                                        local_5b60._0_4_ = local_6060._0_4_;
                                        fStack_5b58 = fStack_6058;
                                        fStack_5b54 = fStack_6054;
                                        fStack_5b50 = fStack_6050;
                                        fStack_5b4c = fStack_604c;
                                        fStack_5b48 = fStack_6048;
                                        fStack_5b44 = fStack_6044;
                                        local_5b40 = local_5ea0._0_8_;
                                        uStack_5b38 = local_5ea0._8_8_;
                                        uStack_5b30 = local_5ea0._16_8_;
                                        uStack_5b28 = local_5ea0._24_8_;
                                        local_5b20 = local_5ec0;
                                        local_5ae0 = auVar236._0_4_ * fVar141;
                                        fStack_5adc = auVar236._4_4_ * fVar162;
                                        fStack_5ad8 = auVar236._8_4_ * fVar163;
                                        fStack_5ad4 = auVar236._12_4_ * fVar164;
                                        fStack_5ad0 = auVar236._16_4_ * fVar165;
                                        fStack_5acc = auVar236._20_4_ * fVar166;
                                        fStack_5ac8 = auVar236._24_4_ * fVar167;
                                        uStack_5ac4 = 0x3f800000;
                                        local_5ac0 = local_5ab0;
                                        local_5aa0 = local_5a90;
                                        auVar134 = vcmpps_avx(local_5b00,local_5b00,0xf);
                                        local_5f18[1] = auVar134;
                                        *local_5f18 = auVar134;
                                        local_5a80 = pRVar10->instID[0];
                                        auVar77._4_4_ = auVar200._4_4_ * fVar162;
                                        auVar77._0_4_ = auVar200._0_4_ * fVar141;
                                        auVar77._8_4_ = auVar200._8_4_ * fVar163;
                                        auVar77._12_4_ = auVar200._12_4_ * fVar164;
                                        auVar77._16_4_ = auVar200._16_4_ * fVar165;
                                        auVar77._20_4_ = auVar200._20_4_ * fVar166;
                                        auVar77._24_4_ = auVar200._24_4_ * fVar167;
                                        auVar77._28_4_ = auVar150._28_4_ + auVar196._28_4_;
                                        uStack_5a7c = local_5a80;
                                        uStack_5a78 = local_5a80;
                                        uStack_5a74 = local_5a80;
                                        uStack_5a70 = local_5a80;
                                        uStack_5a6c = local_5a80;
                                        uStack_5a68 = local_5a80;
                                        uStack_5a64 = local_5a80;
                                        uVar92 = pRVar10->instPrimID[0];
                                        auVar119._4_4_ = uVar92;
                                        auVar119._0_4_ = uVar92;
                                        auVar119._8_4_ = uVar92;
                                        auVar119._12_4_ = uVar92;
                                        local_5a60._16_4_ = uVar92;
                                        local_5a60._0_16_ = auVar119;
                                        local_5a60._20_4_ = uVar92;
                                        local_5a60._24_4_ = uVar92;
                                        local_5a60._28_4_ = uVar92;
                                        auVar134 = *(undefined1 (*) [32])(ray + 0x100);
                                        auVar150 = vblendvps_avx(auVar134,auVar77,auVar138);
                                        *(undefined1 (*) [32])(ray + 0x100) = auVar150;
                                        _local_5fe0 = auVar138;
                                        local_5fc0 = (undefined1  [8])local_5fe0;
                                        uStack_5fb8 = pGVar7->userPtr;
                                        uStack_5fb0 = context->user;
                                        uStack_5fa8 = ray;
                                        local_5fa0 = (RTCHitN *)local_5b60;
                                        local_5f98 = 8;
                                        _local_6060 = auVar236;
                                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          local_5e80._0_4_ = uVar93;
                                          local_6080._0_4_ = uVar95;
                                          auVar210 = ZEXT1664(local_5a90);
                                          local_60a0 = auVar134;
                                          (*pGVar7->occlusionFilterN)
                                                    ((RTCFilterFunctionNArguments *)local_5fc0);
                                          auVar184 = ZEXT3264(local_6020);
                                          lVar100 = local_6068;
                                          lVar102 = local_60c8;
                                          uVar95 = local_6080._0_4_;
                                          auVar134 = local_60a0;
                                          uVar93 = local_5e80._0_4_;
                                        }
                                        auVar111 = vpcmpeqd_avx(ZEXT816(0) << 0x40,_local_5fe0);
                                        auVar142 = vpcmpeqd_avx(ZEXT816(0) << 0x40,_auStack_5fd0);
                                        auVar137._16_16_ = auVar142;
                                        auVar137._0_16_ = auVar111;
                                        auVar150 = vcmpps_avx(ZEXT1632(auVar142),ZEXT1632(auVar142),
                                                              0xf);
                                        auVar196 = auVar150 & ~auVar137;
                                        auVar236 = _local_6060;
                                        if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0 &&
                                                 (auVar196 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar196 >> 0x5f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               SUB321(auVar196 >> 0x7f,0) == '\0') &&
                                              (auVar196 & (undefined1  [32])0x100000000) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar196 >> 0xbf,0) == '\0') &&
                                            (auVar196 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar196[0x1f]) {
                                          auVar138._0_4_ = auVar111._0_4_ ^ auVar150._0_4_;
                                          auVar138._4_4_ = auVar111._4_4_ ^ auVar150._4_4_;
                                          auVar138._8_4_ = auVar111._8_4_ ^ auVar150._8_4_;
                                          auVar138._12_4_ = auVar111._12_4_ ^ auVar150._12_4_;
                                          auVar138._16_4_ = auVar142._0_4_ ^ auVar150._16_4_;
                                          auVar138._20_4_ = auVar142._4_4_ ^ auVar150._20_4_;
                                          auVar138._24_4_ = auVar142._8_4_ ^ auVar150._24_4_;
                                          auVar138._28_4_ = auVar142._12_4_ ^ auVar150._28_4_;
                                        }
                                        else {
                                          p_Var9 = context->args->filter;
                                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                            local_6020 = auVar184._0_32_;
                                            local_5e80._0_4_ = uVar93;
                                            local_6080._0_4_ = uVar95;
                                            auVar210 = ZEXT1664(auVar210._0_16_);
                                            local_60a0 = auVar134;
                                            (*p_Var9)((RTCFilterFunctionNArguments *)local_5fc0);
                                            auVar184 = ZEXT3264(local_6020);
                                            lVar102 = local_60c8;
                                            uVar95 = local_6080._0_4_;
                                            auVar134 = local_60a0;
                                            auVar236 = _local_6060;
                                            uVar93 = local_5e80._0_4_;
                                          }
                                          auVar119 = vpcmpeqd_avx(ZEXT816(0) << 0x40,_local_5fe0);
                                          auVar111 = vpcmpeqd_avx(ZEXT816(0) << 0x40,_auStack_5fd0);
                                          auVar159._16_16_ = auVar111;
                                          auVar159._0_16_ = auVar119;
                                          auVar138._0_8_ = auVar119._0_8_ ^ 0xffffffffffffffff;
                                          auVar138._8_4_ = auVar119._8_4_ ^ 0xffffffff;
                                          auVar138._12_4_ = auVar119._12_4_ ^ 0xffffffff;
                                          auVar138._16_4_ = auVar111._0_4_ ^ 0xffffffff;
                                          auVar138._20_4_ = auVar111._4_4_ ^ 0xffffffff;
                                          auVar138._24_4_ = auVar111._8_4_ ^ 0xffffffff;
                                          auVar138._28_4_ = auVar111._12_4_ ^ 0xffffffff;
                                          auVar119._8_4_ = 0xff800000;
                                          auVar119._0_8_ = 0xff800000ff800000;
                                          auVar119._12_4_ = 0xff800000;
                                          auVar180._16_4_ = 0xff800000;
                                          auVar180._0_16_ = auVar119;
                                          auVar180._20_4_ = 0xff800000;
                                          auVar180._24_4_ = 0xff800000;
                                          auVar180._28_4_ = 0xff800000;
                                          auVar150 = vblendvps_avx(auVar180,*(undefined1 (*) [32])
                                                                             (uStack_5fa8 + 0x100),
                                                                   auVar159);
                                          *(undefined1 (*) [32])(uStack_5fa8 + 0x100) = auVar150;
                                        }
                                        auVar134 = vblendvps_avx(auVar134,*(undefined1 (*) [32])
                                                                           local_6028,auVar138);
                                        *(undefined1 (*) [32])local_6028 = auVar134;
                                      }
                                      auVar134 = vandnps_avx(auVar138,local_60c0);
                                      auVar161 = ZEXT3264(auVar134);
                                      uVar101 = local_6040._0_8_;
                                    }
                                  }
                                  local_6020 = auVar184._0_32_;
                                  auVar134 = auVar161._0_32_;
                                  unaff_R14 = uVar101;
                                  _local_6060 = auVar236;
                                  if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar134 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar134 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar134 >> 0x7f,0) == '\0') &&
                                        (auVar161 & (undefined1  [64])0x100000000) ==
                                        (undefined1  [64])0x0) && SUB321(auVar134 >> 0xbf,0) == '\0'
                                       ) && (auVar161 & (undefined1  [64])0x100000000) ==
                                            (undefined1  [64])0x0) && -1 < auVar161[0x1f]) break;
                                  unaff_R14 = uVar101 + 1;
                                  pfVar99 = pfVar99 + 0x10;
                                  bVar109 = uVar101 < 3;
                                  uVar101 = unaff_R14;
                                } while (bVar109);
                                auVar150 = local_5e00 & auVar134;
                                bVar109 = (((((((auVar150 >> 0x1f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar150 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar150 >> 0x5f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar150 >> 0x7f,0) == '\0') &&
                                            (auVar150 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar150 >> 0xbf,0) == '\0') &&
                                          (auVar150 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) && -1 < auVar150[0x1f];
                                auVar150 = vandps_avx(auVar134,local_5e00);
                                uVar96 = local_5e08;
                                lVar97 = local_5e10;
                                uVar101 = local_5f08;
                                auVar134 = local_5e00;
                              }
                              local_5e00 = auVar150;
                            } while ((!bVar109) && (uVar96 = uVar96 & uVar96 - 1, uVar96 != 0));
                          }
                          lVar97 = local_5e18 + 1;
                        } while (lVar97 != local_5e20);
                        auVar134 = vcmpps_avx(auVar134,auVar134,0xf);
                        auVar139._0_4_ = auVar134._0_4_ ^ local_5e00._0_4_;
                        auVar139._4_4_ = auVar134._4_4_ ^ local_5e00._4_4_;
                        auVar139._8_4_ = auVar134._8_4_ ^ local_5e00._8_4_;
                        auVar139._12_4_ = auVar134._12_4_ ^ local_5e00._12_4_;
                        auVar139._16_4_ = auVar134._16_4_ ^ local_5e00._16_4_;
                        auVar139._20_4_ = auVar134._20_4_ ^ local_5e00._20_4_;
                        auVar139._24_4_ = auVar134._24_4_ ^ local_5e00._24_4_;
                        auVar139._28_4_ = auVar134._28_4_ ^ local_5e00._28_4_;
                      }
                      _local_5e60 = vorps_avx(auVar139,_local_5e60);
                      auVar119 = vpcmpeqd_avx(auVar119,auVar119);
                      auVar111 = vpcmpgtd_avx(local_5e60._16_16_,auVar119);
                      auVar119 = vpcmpgtd_avx(local_5e60._0_16_,auVar119);
                      auVar184 = ZEXT1664(auVar119);
                      auVar119 = vpor_avx(auVar119,auVar111);
                      if ((((auVar119 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar119 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar119 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar119[0xf]) goto LAB_0049a2c0;
                      auVar182._8_4_ = 0xff800000;
                      auVar182._0_8_ = 0xff800000ff800000;
                      auVar182._12_4_ = 0xff800000;
                      auVar182._16_4_ = 0xff800000;
                      auVar182._20_4_ = 0xff800000;
                      auVar182._24_4_ = 0xff800000;
                      auVar182._28_4_ = 0xff800000;
                      auVar184 = ZEXT3264(auVar182);
                      local_5b80 = vblendvps_avx(local_5b80,auVar182,_local_5e60);
                      iVar94 = 0;
                      break;
                    }
                    goto LAB_0049a2d1;
                  }
                  auVar161 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  uVar105 = 0;
                  uVar96 = 8;
                  do {
                    uVar107 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar105 * 8);
                    if (uVar107 != 8) {
                      uVar106 = *(undefined4 *)(root.ptr + 0x40 + uVar105 * 4);
                      auVar121._4_4_ = uVar106;
                      auVar121._0_4_ = uVar106;
                      auVar121._8_4_ = uVar106;
                      auVar121._12_4_ = uVar106;
                      auVar121._16_4_ = uVar106;
                      auVar121._20_4_ = uVar106;
                      auVar121._24_4_ = uVar106;
                      auVar121._28_4_ = uVar106;
                      auVar80._8_8_ = local_5d20._8_8_;
                      auVar80._0_8_ = local_5d20._0_8_;
                      auVar80._16_8_ = local_5d20._16_8_;
                      auVar80._24_8_ = local_5d20._24_8_;
                      auVar82._8_8_ = local_5d20._40_8_;
                      auVar82._0_8_ = local_5d20._32_8_;
                      auVar82._16_8_ = local_5d20._48_8_;
                      auVar82._24_8_ = local_5d20._56_8_;
                      auVar84._8_8_ = local_5d20._72_8_;
                      auVar84._0_8_ = local_5d20._64_8_;
                      auVar84._16_8_ = local_5d20._80_8_;
                      auVar84._24_8_ = local_5d20._88_8_;
                      auVar134 = vsubps_avx(auVar121,auVar80);
                      auVar110._0_4_ = (float)local_5c60._0_4_ * auVar134._0_4_;
                      auVar110._4_4_ = (float)local_5c60._4_4_ * auVar134._4_4_;
                      auVar110._8_4_ = fStack_5c58 * auVar134._8_4_;
                      auVar110._12_4_ = fStack_5c54 * auVar134._12_4_;
                      auVar42._16_4_ = fStack_5c50 * auVar134._16_4_;
                      auVar42._0_16_ = auVar110;
                      auVar42._20_4_ = fStack_5c4c * auVar134._20_4_;
                      auVar42._24_4_ = fStack_5c48 * auVar134._24_4_;
                      auVar42._28_4_ = auVar134._28_4_;
                      uVar106 = *(undefined4 *)(root.ptr + 0x80 + uVar105 * 4);
                      auVar151._4_4_ = uVar106;
                      auVar151._0_4_ = uVar106;
                      auVar151._8_4_ = uVar106;
                      auVar151._12_4_ = uVar106;
                      auVar151._16_4_ = uVar106;
                      auVar151._20_4_ = uVar106;
                      auVar151._24_4_ = uVar106;
                      auVar151._28_4_ = uVar106;
                      auVar134 = vsubps_avx(auVar151,auVar82);
                      auVar143._0_4_ = (float)local_5c40._0_4_ * auVar134._0_4_;
                      auVar143._4_4_ = (float)local_5c40._4_4_ * auVar134._4_4_;
                      auVar143._8_4_ = fStack_5c38 * auVar134._8_4_;
                      auVar143._12_4_ = fStack_5c34 * auVar134._12_4_;
                      auVar43._16_4_ = fStack_5c30 * auVar134._16_4_;
                      auVar43._0_16_ = auVar143;
                      auVar43._20_4_ = fStack_5c2c * auVar134._20_4_;
                      auVar43._24_4_ = fStack_5c28 * auVar134._24_4_;
                      auVar43._28_4_ = auVar134._28_4_;
                      uVar106 = *(undefined4 *)(root.ptr + 0xc0 + uVar105 * 4);
                      auVar171._4_4_ = uVar106;
                      auVar171._0_4_ = uVar106;
                      auVar171._8_4_ = uVar106;
                      auVar171._12_4_ = uVar106;
                      auVar171._16_4_ = uVar106;
                      auVar171._20_4_ = uVar106;
                      auVar171._24_4_ = uVar106;
                      auVar171._28_4_ = uVar106;
                      auVar134 = vsubps_avx(auVar171,auVar84);
                      auVar168._0_4_ = (float)local_5c20._0_4_ * auVar134._0_4_;
                      auVar168._4_4_ = (float)local_5c20._4_4_ * auVar134._4_4_;
                      auVar168._8_4_ = fStack_5c18 * auVar134._8_4_;
                      auVar168._12_4_ = fStack_5c14 * auVar134._12_4_;
                      auVar44._16_4_ = fStack_5c10 * auVar134._16_4_;
                      auVar44._0_16_ = auVar168;
                      auVar44._20_4_ = fStack_5c0c * auVar134._20_4_;
                      auVar44._24_4_ = fStack_5c08 * auVar134._24_4_;
                      auVar44._28_4_ = auVar134._28_4_;
                      uVar106 = *(undefined4 *)(root.ptr + 0x60 + uVar105 * 4);
                      auVar260._4_4_ = uVar106;
                      auVar260._0_4_ = uVar106;
                      auVar260._8_4_ = uVar106;
                      auVar260._12_4_ = uVar106;
                      auVar260._16_4_ = uVar106;
                      auVar260._20_4_ = uVar106;
                      auVar260._24_4_ = uVar106;
                      auVar260._28_4_ = uVar106;
                      auVar134 = vsubps_avx(auVar260,auVar80);
                      auVar186._0_4_ = (float)local_5c60._0_4_ * auVar134._0_4_;
                      auVar186._4_4_ = (float)local_5c60._4_4_ * auVar134._4_4_;
                      auVar186._8_4_ = fStack_5c58 * auVar134._8_4_;
                      auVar186._12_4_ = fStack_5c54 * auVar134._12_4_;
                      auVar45._16_4_ = fStack_5c50 * auVar134._16_4_;
                      auVar45._0_16_ = auVar186;
                      auVar45._20_4_ = fStack_5c4c * auVar134._20_4_;
                      auVar45._24_4_ = fStack_5c48 * auVar134._24_4_;
                      auVar45._28_4_ = auVar134._28_4_;
                      uVar106 = *(undefined4 *)(root.ptr + 0xa0 + uVar105 * 4);
                      auVar231._4_4_ = uVar106;
                      auVar231._0_4_ = uVar106;
                      auVar231._8_4_ = uVar106;
                      auVar231._12_4_ = uVar106;
                      auVar231._16_4_ = uVar106;
                      auVar231._20_4_ = uVar106;
                      auVar231._24_4_ = uVar106;
                      auVar231._28_4_ = uVar106;
                      auVar134 = vsubps_avx(auVar231,auVar82);
                      auVar204._0_4_ = (float)local_5c40._0_4_ * auVar134._0_4_;
                      auVar204._4_4_ = (float)local_5c40._4_4_ * auVar134._4_4_;
                      auVar204._8_4_ = fStack_5c38 * auVar134._8_4_;
                      auVar204._12_4_ = fStack_5c34 * auVar134._12_4_;
                      auVar46._16_4_ = fStack_5c30 * auVar134._16_4_;
                      auVar46._0_16_ = auVar204;
                      auVar46._20_4_ = fStack_5c2c * auVar134._20_4_;
                      auVar46._24_4_ = fStack_5c28 * auVar134._24_4_;
                      auVar46._28_4_ = auVar134._28_4_;
                      auVar210 = ZEXT3264(auVar46);
                      uVar106 = *(undefined4 *)(root.ptr + 0xe0 + uVar105 * 4);
                      auVar232._4_4_ = uVar106;
                      auVar232._0_4_ = uVar106;
                      auVar232._8_4_ = uVar106;
                      auVar232._12_4_ = uVar106;
                      auVar232._16_4_ = uVar106;
                      auVar232._20_4_ = uVar106;
                      auVar232._24_4_ = uVar106;
                      auVar232._28_4_ = uVar106;
                      auVar134 = vsubps_avx(auVar232,auVar84);
                      auVar222._0_4_ = (float)local_5c20._0_4_ * auVar134._0_4_;
                      auVar222._4_4_ = (float)local_5c20._4_4_ * auVar134._4_4_;
                      auVar222._8_4_ = fStack_5c18 * auVar134._8_4_;
                      auVar222._12_4_ = fStack_5c14 * auVar134._12_4_;
                      auVar47._16_4_ = fStack_5c10 * auVar134._16_4_;
                      auVar47._0_16_ = auVar222;
                      auVar47._20_4_ = fStack_5c0c * auVar134._20_4_;
                      auVar47._24_4_ = fStack_5c08 * auVar134._24_4_;
                      auVar47._28_4_ = auVar134._28_4_;
                      auVar119 = vpminsd_avx(auVar42._16_16_,auVar45._16_16_);
                      auVar111 = vpminsd_avx(auVar110,auVar186);
                      auVar142 = vpminsd_avx(auVar43._16_16_,auVar46._16_16_);
                      auVar119 = vpmaxsd_avx(auVar119,auVar142);
                      auVar142 = vpminsd_avx(auVar143,auVar204);
                      auVar111 = vpmaxsd_avx(auVar111,auVar142);
                      auVar142 = vpminsd_avx(auVar168,auVar222);
                      auVar111 = vpmaxsd_avx(auVar111,auVar142);
                      auVar142 = vpminsd_avx(auVar44._16_16_,auVar47._16_16_);
                      auVar119 = vpmaxsd_avx(auVar119,auVar142);
                      auVar142 = vpmaxsd_avx(auVar111,local_5ba0._0_16_);
                      auVar112 = vpmaxsd_avx(auVar119,local_5ba0._16_16_);
                      auVar144 = vpmaxsd_avx(auVar42._16_16_,auVar45._16_16_);
                      auVar187 = vpmaxsd_avx(auVar110,auVar186);
                      auVar113 = vpmaxsd_avx(auVar43._16_16_,auVar46._16_16_);
                      auVar113 = vpminsd_avx(auVar144,auVar113);
                      auVar144 = vpmaxsd_avx(auVar143,auVar204);
                      auVar187 = vpminsd_avx(auVar187,auVar144);
                      auVar144 = vpmaxsd_avx(auVar168,auVar222);
                      auVar187 = vpminsd_avx(auVar187,auVar144);
                      auVar144 = vpmaxsd_avx(auVar44._16_16_,auVar47._16_16_);
                      auVar144 = vpminsd_avx(auVar113,auVar144);
                      auVar187 = vpminsd_avx(auVar187,local_5b80._0_16_);
                      auVar144 = vpminsd_avx(auVar144,local_5b80._16_16_);
                      auVar172._16_16_ = auVar112;
                      auVar172._0_16_ = auVar142;
                      auVar184 = ZEXT3264(auVar172);
                      auVar122._16_16_ = auVar144;
                      auVar122._0_16_ = auVar187;
                      auVar134 = vcmpps_avx(auVar172,auVar122,2);
                      if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar134 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar134 >> 0x7f,0) == '\0') &&
                            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar134 >> 0xbf,0) == '\0') &&
                          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar134[0x1f]) {
                        auVar161 = ZEXT3264(auVar161._0_32_);
                      }
                      else {
                        auVar152._16_16_ = auVar119;
                        auVar152._0_16_ = auVar111;
                        auVar150 = vblendps_avx(auVar152,auVar152,0xf0);
                        auVar173._8_4_ = 0x7f800000;
                        auVar173._0_8_ = 0x7f8000007f800000;
                        auVar173._12_4_ = 0x7f800000;
                        auVar173._16_4_ = 0x7f800000;
                        auVar173._20_4_ = 0x7f800000;
                        auVar173._24_4_ = 0x7f800000;
                        auVar173._28_4_ = 0x7f800000;
                        auVar184 = ZEXT3264(auVar173);
                        auVar134 = vblendvps_avx(auVar173,auVar150,auVar134);
                        if (uVar96 != 8) {
                          *puVar104 = uVar96;
                          puVar104 = puVar104 + 1;
                          local_60c0._0_8_ = auVar161._0_8_;
                          local_60c0._8_8_ = auVar161._8_8_;
                          local_60c0._16_8_ = auVar161._16_8_;
                          local_60c0._24_8_ = auVar161._24_8_;
                          *(undefined8 *)*pauVar108 = local_60c0._0_8_;
                          *(undefined8 *)(*pauVar108 + 8) = local_60c0._8_8_;
                          *(undefined8 *)(*pauVar108 + 0x10) = local_60c0._16_8_;
                          *(undefined8 *)(*pauVar108 + 0x18) = local_60c0._24_8_;
                          pauVar108 = pauVar108 + 1;
                        }
                        auVar161 = ZEXT3264(auVar134);
                        uVar96 = uVar107;
                      }
                    }
                  } while ((uVar107 != 8) && (bVar109 = uVar105 < 7, uVar105 = uVar105 + 1, bVar109)
                          );
                  iVar94 = 0;
                  if (uVar96 == 8) {
LAB_00498c4d:
                    bVar109 = false;
                    iVar94 = 4;
                  }
                  else {
                    auVar134 = vcmpps_avx(local_5b80,auVar161._0_32_,6);
                    uVar106 = vmovmskps_avx(auVar134);
                    bVar109 = true;
                    if ((uint)POPCOUNT(uVar106) <= (uint)uVar101) {
                      *puVar104 = uVar96;
                      puVar104 = puVar104 + 1;
                      *pauVar108 = auVar161._0_32_;
                      pauVar108 = pauVar108 + 1;
                      goto LAB_00498c4d;
                    }
                  }
                  root.ptr = uVar96;
                } while (bVar109);
              }
            }
          }
        } while (iVar94 != 3);
        auVar134 = vandps_avx(local_5940,_local_5e60);
        auVar160._8_4_ = 0xff800000;
        auVar160._0_8_ = 0xff800000ff800000;
        auVar160._12_4_ = 0xff800000;
        auVar160._16_4_ = 0xff800000;
        auVar160._20_4_ = 0xff800000;
        auVar160._24_4_ = 0xff800000;
        auVar160._28_4_ = 0xff800000;
        auVar134 = vmaskmovps_avx(auVar134,auVar160);
        *(undefined1 (*) [32])local_6028 = auVar134;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }